

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_fma::forward_fp16s
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  unsigned_short *puVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  _func_int *p_Var9;
  int *piVar10;
  long lVar11;
  void *pvVar12;
  size_t sVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  ulong uVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  int iVar30;
  undefined1 (*pauVar31) [32];
  long lVar32;
  ulong uVar33;
  uint _elempack;
  long lVar34;
  undefined1 (*pauVar35) [16];
  long lVar36;
  undefined1 (*pauVar37) [16];
  ulong uVar38;
  long lVar39;
  undefined1 (*pauVar40) [16];
  undefined1 (*pauVar41) [32];
  long lVar42;
  undefined1 (*pauVar43) [16];
  long lVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar63 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [32];
  undefined4 extraout_XMM0_Db_04;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar70;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar69 [64];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  __m128 pos_1;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  __m128 pos;
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar111 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar198 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar237 [64];
  undefined1 auVar227 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar238 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [64];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar275 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [64];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [64];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [64];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar361 [32];
  undefined1 auVar359 [16];
  undefined1 auVar362 [32];
  undefined1 auVar360 [16];
  undefined1 auVar363 [64];
  undefined1 (*local_388) [32];
  int *piStack_380;
  size_t local_378;
  int local_370;
  Allocator *local_368;
  int local_360;
  int local_35c;
  undefined8 local_358;
  int local_350;
  size_t local_348;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  ulong local_318;
  long local_310;
  ulong local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  float local_258;
  undefined1 local_248 [16];
  float local_238;
  ulong local_220;
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  Option opt_flatten;
  undefined1 auVar59 [32];
  undefined1 auVar62 [32];
  undefined1 auVar67 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar334 [64];
  
  local_360 = bottom_blob->dims;
  if (local_360 == 2) {
    iVar27 = *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
             *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]);
    local_35c = bottom_blob->w;
    if (bottom_blob->w == iVar27) {
      local_35c = iVar27;
      if (1 < bottom_blob->elempack * bottom_blob->h) {
        Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]
                                     ),bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var9 = this->_vptr_InnerProduct_x86_fma[-3];
        innerproduct_gemm_fp16s_sse
                  (bottom_blob,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x178 + (long)p_Var9),
                   *(int *)(&this->field_0xe0 + (long)p_Var9),
                   (Mat *)(&this->field_0xe8 + (long)p_Var9),opt);
        return 0;
      }
    }
  }
  else {
    local_35c = bottom_blob->w;
  }
  piVar10 = bottom_blob->refcount;
  local_388 = (undefined1 (*) [32])bottom_blob->data;
  piStack_380 = bottom_blob->refcount;
  local_378 = bottom_blob->elemsize;
  local_370 = bottom_blob->elempack;
  local_368 = bottom_blob->allocator;
  local_358._0_4_ = bottom_blob->h;
  local_358._4_4_ = bottom_blob->d;
  local_350 = bottom_blob->c;
  local_348 = bottom_blob->cstep;
  iVar27 = local_360;
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + 1;
    UNLOCK();
    iVar27 = bottom_blob->dims;
  }
  if (iVar27 != 1) {
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_basic = opt->use_subgroup_basic;
    opt_flatten.use_subgroup_vote = opt->use_subgroup_vote;
    opt_flatten.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_flatten.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_reserved_6 = opt->use_reserved_6;
    opt_flatten.use_reserved_7 = opt->use_reserved_7;
    opt_flatten.use_reserved_8 = opt->use_reserved_8;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_388);
  }
  uVar28 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]);
  if (opt->use_packing_layout == true) {
    _elempack = 8;
    if ((uVar28 & 7) != 0) {
      _elempack = (uint)((uVar28 & 3) == 0) * 3 + 1;
    }
  }
  else {
    _elempack = 1;
  }
  Mat::create(top_blob,(int)uVar28 / (int)_elempack,
              (ulong)_elempack * (local_378 / (ulong)(long)local_370),_elempack,opt->blob_allocator)
  ;
  iVar27 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (_elempack == 1) {
      p_Var9 = this->_vptr_InnerProduct_x86_fma[-3];
      iVar30 = local_370 * local_35c;
      iVar27 = *(int *)(&this->field_0xe0 + (long)p_Var9);
      uVar28 = top_blob->w;
      local_318 = (ulong)(int)uVar28;
      lVar11 = *(long *)(&this->field_0x178 + (long)p_Var9);
      uVar33 = 0;
      local_220 = (ulong)(uint)((int)uVar28 >> 3);
      if ((int)uVar28 >> 3 < 1) {
        local_220 = uVar33;
      }
      lVar44 = 7;
      lVar47 = 6;
      lVar34 = 5;
      lVar36 = 4;
      lVar39 = 3;
      lVar42 = 2;
      lVar45 = 1;
      uVar38 = 0;
      while (pauVar31 = local_388, uVar38 != local_220) {
        local_310 = uVar38 * 8;
        auVar73 = ZEXT816(0) << 0x40;
        auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar11 != 0) {
          auVar237 = ZEXT3264(*(undefined1 (*) [32])(lVar11 + uVar38 * 0x20));
        }
        pvVar12 = (this->weight_data_tm).data;
        sVar13 = (this->weight_data_tm).elemsize;
        lVar29 = (long)(this->weight_data_tm).w;
        local_2c8._0_8_ = lVar29;
        lVar32 = 0;
        lVar48 = 0;
        auVar110 = ZEXT816(0) << 0x40;
        auVar192 = ZEXT816(0) << 0x40;
        auVar240 = ZEXT816(0) << 0x40;
        auVar75 = ZEXT816(0) << 0x40;
        auVar54 = ZEXT816(0) << 0x40;
        auVar71 = ZEXT816(0) << 0x40;
        auVar329 = ZEXT816(0) << 0x40;
        iVar46 = 0;
        while( true ) {
          auVar334 = ZEXT1664(auVar329);
          auVar326 = ZEXT1664(auVar71);
          auVar296 = ZEXT1664(auVar54);
          auVar284 = ZEXT1664(auVar240);
          auVar274 = ZEXT1664(auVar75);
          auVar238 = ZEXT1664(auVar192);
          auVar69 = ZEXT1664(auVar110);
          auVar363 = ZEXT1664(auVar73);
          local_138 = ZEXT1632(auVar73);
          local_158 = ZEXT1632(auVar110);
          local_178 = ZEXT1632(auVar192);
          local_1b8 = ZEXT1632(auVar240);
          local_198 = ZEXT1632(auVar75);
          local_1d8 = ZEXT1632(auVar54);
          local_1f8 = ZEXT1632(auVar71);
          local_98 = ZEXT1632(auVar329);
          if (iVar30 <= iVar46 + 7) break;
          auVar64 = *(undefined1 (*) [32])(*local_388 + lVar48 * 2);
          auVar73 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar12 + lVar48 + sVar13 * uVar33 * lVar29));
          auVar66 = vcvtph2ps_f16c(auVar73);
          auVar73 = vfmadd231ps_fma(local_138,auVar64,auVar66);
          auVar110 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar12 + lVar48 + sVar13 * lVar45 * lVar29));
          auVar66 = vcvtph2ps_f16c(auVar110);
          auVar110 = vfmadd231ps_fma(local_158,auVar64,auVar66);
          auVar192 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar12 + lVar48 + sVar13 * lVar42 * lVar29));
          auVar66 = vcvtph2ps_f16c(auVar192);
          auVar192 = vfmadd231ps_fma(local_178,auVar64,auVar66);
          auVar240 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar12 + lVar48 + sVar13 * lVar39 * lVar29));
          auVar66 = vcvtph2ps_f16c(auVar240);
          auVar240 = vfmadd231ps_fma(local_1b8,auVar64,auVar66);
          auVar75 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar12 + lVar48 + sVar13 * lVar36 * lVar29));
          auVar66 = vcvtph2ps_f16c(auVar75);
          auVar75 = vfmadd231ps_fma(local_198,auVar64,auVar66);
          auVar54 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar12 + lVar48 + sVar13 * lVar34 * lVar29));
          auVar66 = vcvtph2ps_f16c(auVar54);
          auVar54 = vfmadd231ps_fma(local_1d8,auVar64,auVar66);
          auVar71 = vlddqu_avx(*(undefined1 (*) [16])
                                ((long)pvVar12 + lVar48 + sVar13 * lVar47 * lVar29));
          auVar66 = vcvtph2ps_f16c(auVar71);
          auVar71 = vfmadd231ps_fma(local_1f8,auVar64,auVar66);
          auVar329 = vlddqu_avx(*(undefined1 (*) [16])
                                 ((long)pvVar12 + lVar48 + sVar13 * lVar44 * lVar29));
          auVar66 = vcvtph2ps_f16c(auVar329);
          auVar329 = vfmadd231ps_fma(local_98,auVar64,auVar66);
          iVar46 = iVar46 + 8;
          lVar48 = lVar48 + 0x10;
          lVar32 = lVar32 + 8;
        }
        lVar29 = sVar13 * lVar29;
        local_308 = uVar38;
        local_300 = lVar45;
        local_2f8 = lVar42;
        local_2f0 = lVar39;
        local_2e8 = lVar36;
        local_2e0 = lVar34;
        local_2d8 = lVar47;
        local_2d0 = lVar44;
        for (; (int)lVar32 < iVar30; lVar32 = lVar32 + 1) {
          puVar1 = (unsigned_short *)((long)pvVar12 + lVar32 * 2 + lVar29 * uVar33);
          local_328 = ZEXT416(*(uint *)(*pauVar31 + lVar32 * 4));
          local_2c8 = auVar237._0_32_;
          fVar49 = float16_to_float32(*puVar1);
          auVar64 = local_218;
          local_218._4_4_ = extraout_XMM0_Db;
          local_218._0_4_ = fVar49;
          local_218._8_4_ = extraout_XMM0_Dc;
          local_218._16_16_ = auVar64._16_16_;
          local_218._12_4_ = extraout_XMM0_Dd;
          local_338 = ZEXT416(*(uint *)(*pauVar31 + lVar32 * 4));
          local_238 = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar29));
          local_248 = ZEXT416(*(uint *)(*pauVar31 + lVar32 * 4));
          local_258 = float16_to_float32(puVar1[lVar29]);
          local_268 = ZEXT416(*(uint *)(*pauVar31 + lVar32 * 4));
          fVar49 = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar29 * 3));
          auVar64 = local_b8;
          local_b8._4_4_ = extraout_XMM0_Db_00;
          local_b8._0_4_ = fVar49;
          local_b8._8_4_ = extraout_XMM0_Dc_00;
          local_b8._16_16_ = auVar64._16_16_;
          local_b8._12_4_ = extraout_XMM0_Dd_00;
          local_d8._0_16_ = ZEXT416(*(uint *)(*pauVar31 + lVar32 * 4));
          fVar49 = float16_to_float32(puVar1[lVar29 * 2]);
          auVar64 = local_f8;
          local_f8._4_4_ = extraout_XMM0_Db_01;
          local_f8._0_4_ = fVar49;
          local_f8._8_4_ = extraout_XMM0_Dc_01;
          local_f8._16_16_ = auVar64._16_16_;
          local_f8._12_4_ = extraout_XMM0_Dd_01;
          local_118._0_16_ = ZEXT416(*(uint *)(*pauVar31 + lVar32 * 4));
          local_278._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar29 * 5));
          local_278._4_4_ = extraout_XMM0_Db_02;
          local_278._8_4_ = extraout_XMM0_Dc_02;
          local_278._12_4_ = extraout_XMM0_Dd_02;
          local_288 = ZEXT416(*(uint *)(*pauVar31 + lVar32 * 4));
          local_298._0_4_ = float16_to_float32(puVar1[lVar29 * 3]);
          local_298._4_4_ = extraout_XMM0_Db_03;
          local_298._8_4_ = extraout_XMM0_Dc_03;
          local_298._12_4_ = extraout_XMM0_Dd_03;
          local_2a8 = ZEXT416(*(uint *)(*pauVar31 + lVar32 * 4));
          auVar237._0_4_ = float16_to_float32(*(unsigned_short *)((long)puVar1 + lVar29 * 7));
          auVar237._4_60_ = extraout_var;
          auVar73 = vinsertps_avx(local_f8._0_16_,ZEXT416((uint)local_278._0_4_),0x10);
          auVar73 = vinsertps_avx(auVar73,ZEXT416((uint)local_298._0_4_),0x20);
          auVar73 = vinsertps_avx(auVar73,auVar237._0_16_,0x30);
          auVar110 = vinsertps_avx(local_218._0_16_,ZEXT416((uint)local_238),0x10);
          auVar110 = vinsertps_avx(auVar110,ZEXT416((uint)local_258),0x20);
          auVar110 = vinsertps_avx(auVar110,ZEXT416((uint)local_b8._0_4_),0x30);
          auVar64._16_16_ = auVar73;
          auVar64._0_16_ = auVar110;
          auVar73 = vinsertps_avx(local_d8._0_16_,ZEXT416((uint)local_118._0_4_),0x10);
          auVar73 = vinsertps_avx(auVar73,ZEXT416((uint)local_288._0_4_),0x20);
          auVar73 = vinsertps_avx(auVar73,ZEXT416((uint)local_2a8._0_4_),0x30);
          auVar110 = vinsertps_avx(local_328,ZEXT416((uint)local_338._0_4_),0x10);
          auVar110 = vinsertps_avx(auVar110,ZEXT416((uint)local_248._0_4_),0x20);
          auVar110 = vinsertps_avx(auVar110,ZEXT416((uint)local_268._0_4_),0x30);
          auVar66._16_16_ = auVar73;
          auVar66._0_16_ = auVar110;
          auVar73 = vfmadd231ps_fma(local_2c8,auVar64,auVar66);
          auVar237 = ZEXT1664(auVar73);
          auVar363 = ZEXT3264(local_138);
          auVar69 = ZEXT3264(local_158);
          auVar238 = ZEXT3264(local_178);
          auVar274 = ZEXT3264(local_198);
          auVar284 = ZEXT3264(local_1b8);
          auVar296 = ZEXT3264(local_1d8);
          auVar326 = ZEXT3264(local_1f8);
          auVar334 = ZEXT3264(local_98);
        }
        auVar64 = vhaddps_avx(auVar363._0_32_,auVar69._0_32_);
        auVar66 = vhaddps_avx(auVar238._0_32_,auVar284._0_32_);
        auVar66 = vhaddps_avx(auVar64,auVar66);
        auVar64 = vhaddps_avx(auVar274._0_32_,auVar296._0_32_);
        auVar61 = vhaddps_avx(auVar326._0_32_,auVar334._0_32_);
        auVar61 = vhaddps_avx(auVar64,auVar61);
        auVar64 = vblendps_avx(auVar66,auVar61,0xf0);
        auVar66 = vperm2f128_avx(auVar66,auVar61,0x21);
        fVar49 = auVar66._0_4_ + auVar237._0_4_ + auVar64._0_4_;
        fVar70 = auVar66._4_4_ + auVar237._4_4_ + auVar64._4_4_;
        auVar61._0_8_ = CONCAT44(fVar70,fVar49);
        auVar61._8_4_ = auVar66._8_4_ + auVar237._8_4_ + auVar64._8_4_;
        auVar61._12_4_ = auVar66._12_4_ + auVar237._12_4_ + auVar64._12_4_;
        auVar61._16_4_ = auVar66._16_4_ + auVar237._16_4_ + auVar64._16_4_;
        auVar61._20_4_ = auVar66._20_4_ + auVar237._20_4_ + auVar64._20_4_;
        auVar61._24_4_ = auVar66._24_4_ + auVar237._24_4_ + auVar64._24_4_;
        auVar61._28_4_ = auVar66._28_4_ + auVar237._28_4_ + auVar64._28_4_;
        auVar64 = auVar61;
        if (5 < iVar27 - 1U) goto switchD_002f5fd2_caseD_1;
        auVar64 = vmaxps_avx(auVar61,ZEXT832(0) << 0x20);
        switch(iVar27) {
        case 2:
          auVar66 = vminps_avx(auVar61,ZEXT832(0) << 0x20);
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar148._4_4_ = uVar2;
          auVar148._0_4_ = uVar2;
          auVar148._8_4_ = uVar2;
          auVar148._12_4_ = uVar2;
          auVar148._16_4_ = uVar2;
          auVar148._20_4_ = uVar2;
          auVar148._24_4_ = uVar2;
          auVar148._28_4_ = uVar2;
          auVar73 = vfmadd231ps_fma(auVar64,auVar66,auVar148);
          auVar64 = ZEXT1632(auVar73);
          break;
        case 3:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar104._4_4_ = uVar2;
          auVar104._0_4_ = uVar2;
          auVar104._8_4_ = uVar2;
          auVar104._12_4_ = uVar2;
          auVar104._16_4_ = uVar2;
          auVar104._20_4_ = uVar2;
          auVar104._24_4_ = uVar2;
          auVar104._28_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar154._4_4_ = uVar2;
          auVar154._0_4_ = uVar2;
          auVar154._8_4_ = uVar2;
          auVar154._12_4_ = uVar2;
          auVar154._16_4_ = uVar2;
          auVar154._20_4_ = uVar2;
          auVar154._24_4_ = uVar2;
          auVar154._28_4_ = uVar2;
          auVar64 = vmaxps_avx(auVar61,auVar104);
          auVar64 = vminps_avx(auVar64,auVar154);
          break;
        case 4:
          auVar65._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
          auVar65._8_4_ = -auVar61._8_4_;
          auVar65._12_4_ = -auVar61._12_4_;
          auVar65._16_4_ = -auVar61._16_4_;
          auVar65._20_4_ = -auVar61._20_4_;
          auVar65._24_4_ = -auVar61._24_4_;
          auVar65._28_4_ = -auVar61._28_4_;
          auVar105._8_4_ = 0x42b0c0a5;
          auVar105._0_8_ = 0x42b0c0a542b0c0a5;
          auVar105._12_4_ = 0x42b0c0a5;
          auVar105._16_4_ = 0x42b0c0a5;
          auVar105._20_4_ = 0x42b0c0a5;
          auVar105._24_4_ = 0x42b0c0a5;
          auVar105._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar65,auVar105);
          auVar106._8_4_ = 0xc2b0c0a5;
          auVar106._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar106._12_4_ = 0xc2b0c0a5;
          auVar106._16_4_ = 0xc2b0c0a5;
          auVar106._20_4_ = 0xc2b0c0a5;
          auVar106._24_4_ = 0xc2b0c0a5;
          auVar106._28_4_ = 0xc2b0c0a5;
          auVar66 = vmaxps_avx(auVar64,auVar106);
          auVar107._8_4_ = 0x3fb8aa3b;
          auVar107._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar107._12_4_ = 0x3fb8aa3b;
          auVar107._16_4_ = 0x3fb8aa3b;
          auVar107._20_4_ = 0x3fb8aa3b;
          auVar107._24_4_ = 0x3fb8aa3b;
          auVar107._28_4_ = 0x3fb8aa3b;
          auVar214._8_4_ = 0x3f000000;
          auVar214._0_8_ = 0x3f0000003f000000;
          auVar214._12_4_ = 0x3f000000;
          auVar214._16_4_ = 0x3f000000;
          auVar214._20_4_ = 0x3f000000;
          auVar214._24_4_ = 0x3f000000;
          auVar214._28_4_ = 0x3f000000;
          auVar73 = vfmadd213ps_fma(auVar107,auVar66,auVar214);
          auVar61 = vroundps_avx(ZEXT1632(auVar73),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar73),auVar61,1);
          auVar236._8_4_ = 0x3f800000;
          auVar236._0_8_ = 0x3f8000003f800000;
          auVar236._12_4_ = 0x3f800000;
          auVar236._16_4_ = 0x3f800000;
          auVar236._20_4_ = 0x3f800000;
          auVar236._24_4_ = 0x3f800000;
          auVar236._28_4_ = 0x3f800000;
          auVar64 = vandps_avx(auVar64,auVar236);
          auVar64 = vsubps_avx(auVar61,auVar64);
          auVar155._8_4_ = 0x3f318000;
          auVar155._0_8_ = 0x3f3180003f318000;
          auVar155._12_4_ = 0x3f318000;
          auVar155._16_4_ = 0x3f318000;
          auVar155._20_4_ = 0x3f318000;
          auVar155._24_4_ = 0x3f318000;
          auVar155._28_4_ = 0x3f318000;
          auVar73 = vfmsub231ps_fma(auVar66,auVar64,auVar155);
          auVar156._8_4_ = 0x395e8083;
          auVar156._0_8_ = 0x395e8083395e8083;
          auVar156._12_4_ = 0x395e8083;
          auVar156._16_4_ = 0x395e8083;
          auVar156._20_4_ = 0x395e8083;
          auVar156._24_4_ = 0x395e8083;
          auVar156._28_4_ = 0x395e8083;
          auVar110 = vfmsub231ps_fma(ZEXT1632(auVar73),auVar64,auVar156);
          auVar66 = ZEXT1632(auVar110);
          auVar24._28_4_ = 0x395e8083;
          auVar24._0_28_ =
               ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                  CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                           CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                    auVar110._0_4_ * auVar110._0_4_))));
          auVar187._8_4_ = 0x39506967;
          auVar187._0_8_ = 0x3950696739506967;
          auVar187._12_4_ = 0x39506967;
          auVar187._16_4_ = 0x39506967;
          auVar187._20_4_ = 0x39506967;
          auVar187._24_4_ = 0x39506967;
          auVar187._28_4_ = 0x39506967;
          auVar270._8_4_ = 0x3ab743ce;
          auVar270._0_8_ = 0x3ab743ce3ab743ce;
          auVar270._12_4_ = 0x3ab743ce;
          auVar270._16_4_ = 0x3ab743ce;
          auVar270._20_4_ = 0x3ab743ce;
          auVar270._24_4_ = 0x3ab743ce;
          auVar270._28_4_ = 0x3ab743ce;
          auVar73 = vfmadd213ps_fma(auVar187,auVar66,auVar270);
          auVar271._8_4_ = 0x3c088908;
          auVar271._0_8_ = 0x3c0889083c088908;
          auVar271._12_4_ = 0x3c088908;
          auVar271._16_4_ = 0x3c088908;
          auVar271._20_4_ = 0x3c088908;
          auVar271._24_4_ = 0x3c088908;
          auVar271._28_4_ = 0x3c088908;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar271);
          auVar272._8_4_ = 0x3d2aa9c1;
          auVar272._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar272._12_4_ = 0x3d2aa9c1;
          auVar272._16_4_ = 0x3d2aa9c1;
          auVar272._20_4_ = 0x3d2aa9c1;
          auVar272._24_4_ = 0x3d2aa9c1;
          auVar272._28_4_ = 0x3d2aa9c1;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar272);
          auVar273._8_4_ = 0x3e2aaaaa;
          auVar273._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar273._12_4_ = 0x3e2aaaaa;
          auVar273._16_4_ = 0x3e2aaaaa;
          auVar273._20_4_ = 0x3e2aaaaa;
          auVar273._24_4_ = 0x3e2aaaaa;
          auVar273._28_4_ = 0x3e2aaaaa;
          auVar66 = ZEXT1632(auVar110);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar273);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar214);
          auVar192 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar24,auVar66);
          auVar54._0_4_ = (int)auVar64._0_4_;
          auVar54._4_4_ = (int)auVar64._4_4_;
          auVar54._8_4_ = (int)auVar64._8_4_;
          auVar54._12_4_ = (int)auVar64._12_4_;
          auVar67._16_4_ = (int)auVar64._16_4_;
          auVar67._0_16_ = auVar54;
          auVar67._20_4_ = (int)auVar64._20_4_;
          auVar67._24_4_ = (int)auVar64._24_4_;
          auVar67._28_4_ = (int)auVar64._28_4_;
          auVar110 = vpslld_avx(auVar54,0x17);
          auVar73 = vpslld_avx(auVar67._16_16_,0x17);
          auVar71._8_4_ = 0x3f800000;
          auVar71._0_8_ = 0x3f8000003f800000;
          auVar71._12_4_ = 0x3f800000;
          auVar73 = vpaddd_avx(auVar73,auVar71);
          auVar110 = vpaddd_avx(auVar110,auVar71);
          auVar108._16_16_ = auVar73;
          auVar108._0_16_ = auVar110;
          auVar68._0_4_ = auVar192._0_4_ + 1.0;
          auVar68._4_4_ = auVar192._4_4_ + 1.0;
          auVar68._8_4_ = auVar192._8_4_ + 1.0;
          auVar68._12_4_ = auVar192._12_4_ + 1.0;
          auVar68._16_4_ = 0x3f800000;
          auVar68._20_4_ = 0x3f800000;
          auVar68._24_4_ = 0x3f800000;
          auVar68._28_4_ = 0x3f800000;
          auVar73 = vfmadd213ps_fma(auVar108,auVar68,auVar236);
          auVar64 = vrcpps_avx(ZEXT1632(auVar73));
          auVar73 = vfmsub213ps_fma(ZEXT1632(auVar73),auVar64,auVar236);
          auVar73 = vfnmadd132ps_fma(ZEXT1632(auVar73),auVar64,auVar64);
          auVar64 = ZEXT1632(auVar73);
          break;
        case 5:
          auVar324._8_4_ = 0x42b0c0a5;
          auVar324._0_8_ = 0x42b0c0a542b0c0a5;
          auVar324._12_4_ = 0x42b0c0a5;
          auVar324._16_4_ = 0x42b0c0a5;
          auVar324._20_4_ = 0x42b0c0a5;
          auVar324._24_4_ = 0x42b0c0a5;
          auVar324._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar324,auVar61);
          auVar333._8_4_ = 0xc2b0c0a5;
          auVar333._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar333._12_4_ = 0xc2b0c0a5;
          auVar333._16_4_ = 0xc2b0c0a5;
          auVar333._20_4_ = 0xc2b0c0a5;
          auVar333._24_4_ = 0xc2b0c0a5;
          auVar333._28_4_ = 0xc2b0c0a5;
          auVar66 = vmaxps_avx(auVar333,auVar64);
          auVar347._8_4_ = 0x3fb8aa3b;
          auVar347._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar347._12_4_ = 0x3fb8aa3b;
          auVar347._16_4_ = 0x3fb8aa3b;
          auVar347._20_4_ = 0x3fb8aa3b;
          auVar347._24_4_ = 0x3fb8aa3b;
          auVar347._28_4_ = 0x3fb8aa3b;
          auVar341._8_4_ = 0x3f000000;
          auVar341._0_8_ = 0x3f0000003f000000;
          auVar341._12_4_ = 0x3f000000;
          auVar341._16_4_ = 0x3f000000;
          auVar341._20_4_ = 0x3f000000;
          auVar341._24_4_ = 0x3f000000;
          auVar341._28_4_ = 0x3f000000;
          auVar73 = vfmadd213ps_fma(auVar347,auVar66,auVar341);
          auVar109 = vroundps_avx(ZEXT1632(auVar73),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar73),auVar109,1);
          auVar354._8_4_ = 0x3f800000;
          auVar354._0_8_ = 0x3f8000003f800000;
          auVar354._12_4_ = 0x3f800000;
          auVar354._16_4_ = 0x3f800000;
          auVar354._20_4_ = 0x3f800000;
          auVar354._24_4_ = 0x3f800000;
          auVar354._28_4_ = 0x3f800000;
          auVar64 = vandps_avx(auVar354,auVar64);
          auVar64 = vsubps_avx(auVar109,auVar64);
          auVar358._8_4_ = 0x3f318000;
          auVar358._0_8_ = 0x3f3180003f318000;
          auVar358._12_4_ = 0x3f318000;
          auVar358._16_4_ = 0x3f318000;
          auVar358._20_4_ = 0x3f318000;
          auVar358._24_4_ = 0x3f318000;
          auVar358._28_4_ = 0x3f318000;
          auVar73 = vfmsub231ps_fma(auVar66,auVar64,auVar358);
          auVar325._8_4_ = 0xb95e8083;
          auVar325._0_8_ = 0xb95e8083b95e8083;
          auVar325._12_4_ = 0xb95e8083;
          auVar325._16_4_ = 0xb95e8083;
          auVar325._20_4_ = 0xb95e8083;
          auVar325._24_4_ = 0xb95e8083;
          auVar325._28_4_ = 0xb95e8083;
          auVar110 = vfnmsub231ps_fma(ZEXT1632(auVar73),auVar64,auVar325);
          auVar66 = ZEXT1632(auVar110);
          auVar22._28_4_ = auVar109._28_4_;
          auVar22._0_28_ =
               ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                  CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                           CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                    auVar110._0_4_ * auVar110._0_4_))));
          auVar211._8_4_ = 0x39506967;
          auVar211._0_8_ = 0x3950696739506967;
          auVar211._12_4_ = 0x39506967;
          auVar211._16_4_ = 0x39506967;
          auVar211._20_4_ = 0x39506967;
          auVar211._24_4_ = 0x39506967;
          auVar211._28_4_ = 0x39506967;
          auVar362._8_4_ = 0x3ab743ce;
          auVar362._0_8_ = 0x3ab743ce3ab743ce;
          auVar362._12_4_ = 0x3ab743ce;
          auVar362._16_4_ = 0x3ab743ce;
          auVar362._20_4_ = 0x3ab743ce;
          auVar362._24_4_ = 0x3ab743ce;
          auVar362._28_4_ = 0x3ab743ce;
          auVar73 = vfmadd213ps_fma(auVar211,auVar66,auVar362);
          auVar228._8_4_ = 0x3c088908;
          auVar228._0_8_ = 0x3c0889083c088908;
          auVar228._12_4_ = 0x3c088908;
          auVar228._16_4_ = 0x3c088908;
          auVar228._20_4_ = 0x3c088908;
          auVar228._24_4_ = 0x3c088908;
          auVar228._28_4_ = 0x3c088908;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar228);
          auVar229._8_4_ = 0x3d2aa9c1;
          auVar229._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar229._12_4_ = 0x3d2aa9c1;
          auVar229._16_4_ = 0x3d2aa9c1;
          auVar229._20_4_ = 0x3d2aa9c1;
          auVar229._24_4_ = 0x3d2aa9c1;
          auVar229._28_4_ = 0x3d2aa9c1;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar229);
          auVar230._8_4_ = 0x3e2aaaaa;
          auVar230._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar230._12_4_ = 0x3e2aaaaa;
          auVar230._16_4_ = 0x3e2aaaaa;
          auVar230._20_4_ = 0x3e2aaaaa;
          auVar230._24_4_ = 0x3e2aaaaa;
          auVar230._28_4_ = 0x3e2aaaaa;
          auVar66 = ZEXT1632(auVar110);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar230);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar341);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar22,auVar66);
          auVar184._0_4_ = auVar73._0_4_ + 1.0;
          auVar184._4_4_ = auVar73._4_4_ + 1.0;
          auVar184._8_4_ = auVar73._8_4_ + 1.0;
          auVar184._12_4_ = auVar73._12_4_ + 1.0;
          auVar184._16_4_ = 0x3f800000;
          auVar184._20_4_ = 0x3f800000;
          auVar184._24_4_ = 0x3f800000;
          auVar184._28_4_ = 0x3f800000;
          auVar73._0_4_ = (int)auVar64._0_4_;
          auVar73._4_4_ = (int)auVar64._4_4_;
          auVar73._8_4_ = (int)auVar64._8_4_;
          auVar73._12_4_ = (int)auVar64._12_4_;
          auVar100._16_4_ = (int)auVar64._16_4_;
          auVar100._0_16_ = auVar73;
          auVar100._20_4_ = (int)auVar64._20_4_;
          auVar100._24_4_ = (int)auVar64._24_4_;
          auVar100._28_4_ = (int)auVar64._28_4_;
          auVar110 = vpslld_avx(auVar73,0x17);
          auVar73 = vpslld_avx(auVar100._16_16_,0x17);
          auVar75._8_4_ = 0x3f800000;
          auVar75._0_8_ = 0x3f8000003f800000;
          auVar75._12_4_ = 0x3f800000;
          auVar73 = vpaddd_avx(auVar73,auVar75);
          auVar110 = vpaddd_avx(auVar110,auVar75);
          auVar101._16_16_ = auVar73;
          auVar101._0_16_ = auVar110;
          auVar192 = vfmadd213ps_fma(auVar101,auVar184,auVar354);
          auVar149._8_4_ = 0x800000;
          auVar149._0_8_ = 0x80000000800000;
          auVar149._12_4_ = 0x800000;
          auVar149._16_4_ = 0x800000;
          auVar149._20_4_ = 0x800000;
          auVar149._24_4_ = 0x800000;
          auVar149._28_4_ = 0x800000;
          auVar64 = vmaxps_avx(ZEXT1632(auVar192),auVar149);
          auVar110 = vpsrld_avx(auVar64._0_16_,0x17);
          auVar73 = vpsrld_avx(auVar64._16_16_,0x17);
          auVar231._8_4_ = 0x807fffff;
          auVar231._0_8_ = 0x807fffff807fffff;
          auVar231._12_4_ = 0x807fffff;
          auVar231._16_4_ = 0x807fffff;
          auVar231._20_4_ = 0x807fffff;
          auVar231._24_4_ = 0x807fffff;
          auVar231._28_4_ = 0x807fffff;
          auVar64 = vandps_avx(auVar64,auVar231);
          auVar109 = vorps_avx(auVar341,auVar64);
          auVar232._8_4_ = 0x3f3504f3;
          auVar232._0_8_ = 0x3f3504f33f3504f3;
          auVar232._12_4_ = 0x3f3504f3;
          auVar232._16_4_ = 0x3f3504f3;
          auVar232._20_4_ = 0x3f3504f3;
          auVar232._24_4_ = 0x3f3504f3;
          auVar232._28_4_ = 0x3f3504f3;
          auVar66 = vcmpps_avx(auVar232,auVar109,2);
          auVar64 = vandnps_avx(auVar66,auVar109);
          auVar295._8_4_ = 0xbf800000;
          auVar295._0_8_ = 0xbf800000bf800000;
          auVar295._12_4_ = 0xbf800000;
          auVar295._16_4_ = 0xbf800000;
          auVar295._20_4_ = 0xbf800000;
          auVar295._24_4_ = 0xbf800000;
          auVar295._28_4_ = 0xbf800000;
          auVar150._0_4_ = auVar109._0_4_ + -1.0 + auVar64._0_4_;
          auVar150._4_4_ = auVar109._4_4_ + -1.0 + auVar64._4_4_;
          auVar150._8_4_ = auVar109._8_4_ + -1.0 + auVar64._8_4_;
          auVar150._12_4_ = auVar109._12_4_ + -1.0 + auVar64._12_4_;
          auVar150._16_4_ = auVar109._16_4_ + -1.0 + auVar64._16_4_;
          auVar150._20_4_ = auVar109._20_4_ + -1.0 + auVar64._20_4_;
          auVar150._24_4_ = auVar109._24_4_ + -1.0 + auVar64._24_4_;
          auVar150._28_4_ = auVar109._28_4_ + -1.0 + auVar64._28_4_;
          auVar73 = vpsubd_avx(auVar73,auVar66._16_16_);
          auVar240._8_4_ = 0xffffff81;
          auVar240._0_8_ = 0xffffff81ffffff81;
          auVar240._12_4_ = 0xffffff81;
          auVar73 = vpaddd_avx(auVar73,auVar240);
          auVar110 = vpsubd_avx(auVar110,auVar66._0_16_);
          auVar110 = vpaddd_avx(auVar110,auVar240);
          auVar185._16_16_ = auVar73;
          auVar185._0_16_ = auVar110;
          auVar212._0_4_ = auVar150._0_4_ * auVar150._0_4_;
          auVar212._4_4_ = auVar150._4_4_ * auVar150._4_4_;
          auVar212._8_4_ = auVar150._8_4_ * auVar150._8_4_;
          auVar212._12_4_ = auVar150._12_4_ * auVar150._12_4_;
          auVar212._16_4_ = auVar150._16_4_ * auVar150._16_4_;
          auVar212._20_4_ = auVar150._20_4_ * auVar150._20_4_;
          auVar212._24_4_ = auVar150._24_4_ * auVar150._24_4_;
          auVar212._28_4_ = 0;
          auVar233._8_4_ = 0x3d9021bb;
          auVar233._0_8_ = 0x3d9021bb3d9021bb;
          auVar233._12_4_ = 0x3d9021bb;
          auVar233._16_4_ = 0x3d9021bb;
          auVar233._20_4_ = 0x3d9021bb;
          auVar233._24_4_ = 0x3d9021bb;
          auVar233._28_4_ = 0x3d9021bb;
          auVar259._8_4_ = 0xbdebd1b8;
          auVar259._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar259._12_4_ = 0xbdebd1b8;
          auVar259._16_4_ = 0xbdebd1b8;
          auVar259._20_4_ = 0xbdebd1b8;
          auVar259._24_4_ = 0xbdebd1b8;
          auVar259._28_4_ = 0xbdebd1b8;
          auVar73 = vfmadd213ps_fma(auVar233,auVar150,auVar259);
          auVar260._8_4_ = 0x3def251a;
          auVar260._0_8_ = 0x3def251a3def251a;
          auVar260._12_4_ = 0x3def251a;
          auVar260._16_4_ = 0x3def251a;
          auVar260._20_4_ = 0x3def251a;
          auVar260._24_4_ = 0x3def251a;
          auVar260._28_4_ = 0x3def251a;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar150,auVar260);
          auVar261._8_4_ = 0xbdfe5d4f;
          auVar261._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar261._12_4_ = 0xbdfe5d4f;
          auVar261._16_4_ = 0xbdfe5d4f;
          auVar261._20_4_ = 0xbdfe5d4f;
          auVar261._24_4_ = 0xbdfe5d4f;
          auVar261._28_4_ = 0xbdfe5d4f;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar150,auVar261);
          auVar262._8_4_ = 0x3e11e9bf;
          auVar262._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar262._12_4_ = 0x3e11e9bf;
          auVar262._16_4_ = 0x3e11e9bf;
          auVar262._20_4_ = 0x3e11e9bf;
          auVar262._24_4_ = 0x3e11e9bf;
          auVar262._28_4_ = 0x3e11e9bf;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar150,auVar262);
          auVar263._8_4_ = 0xbe2aae50;
          auVar263._0_8_ = 0xbe2aae50be2aae50;
          auVar263._12_4_ = 0xbe2aae50;
          auVar263._16_4_ = 0xbe2aae50;
          auVar263._20_4_ = 0xbe2aae50;
          auVar263._24_4_ = 0xbe2aae50;
          auVar263._28_4_ = 0xbe2aae50;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar150,auVar263);
          auVar264._8_4_ = 0x3e4cceac;
          auVar264._0_8_ = 0x3e4cceac3e4cceac;
          auVar264._12_4_ = 0x3e4cceac;
          auVar264._16_4_ = 0x3e4cceac;
          auVar264._20_4_ = 0x3e4cceac;
          auVar264._24_4_ = 0x3e4cceac;
          auVar264._28_4_ = 0x3e4cceac;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar150,auVar264);
          auVar265._8_4_ = 0xbe7ffffc;
          auVar265._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar265._12_4_ = 0xbe7ffffc;
          auVar265._16_4_ = 0xbe7ffffc;
          auVar265._20_4_ = 0xbe7ffffc;
          auVar265._24_4_ = 0xbe7ffffc;
          auVar265._28_4_ = 0xbe7ffffc;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar150,auVar265);
          auVar266._8_4_ = 0x3eaaaaaa;
          auVar266._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar266._12_4_ = 0x3eaaaaaa;
          auVar266._16_4_ = 0x3eaaaaaa;
          auVar266._20_4_ = 0x3eaaaaaa;
          auVar266._24_4_ = 0x3eaaaaaa;
          auVar266._28_4_ = 0x3eaaaaaa;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar150,auVar266);
          auVar234._0_4_ = auVar212._0_4_ * auVar150._0_4_ * auVar73._0_4_;
          auVar234._4_4_ = auVar212._4_4_ * auVar150._4_4_ * auVar73._4_4_;
          auVar234._8_4_ = auVar212._8_4_ * auVar150._8_4_ * auVar73._8_4_;
          auVar234._12_4_ = auVar212._12_4_ * auVar150._12_4_ * auVar73._12_4_;
          auVar234._16_4_ = auVar212._16_4_ * auVar150._16_4_ * 0.0;
          auVar234._20_4_ = auVar212._20_4_ * auVar150._20_4_ * 0.0;
          auVar234._24_4_ = auVar212._24_4_ * auVar150._24_4_ * 0.0;
          auVar234._28_4_ = 0;
          auVar66 = vcvtdq2ps_avx(auVar185);
          auVar73 = vfmadd231ps_fma(auVar234,auVar66,auVar325);
          auVar73 = vfmsub231ps_fma(ZEXT1632(auVar73),auVar341,auVar212);
          auVar64 = vcmpps_avx(ZEXT1632(auVar192),_DAT_004dd0e0,2);
          auVar109 = vsubps_avx(ZEXT1632(auVar73),auVar150);
          auVar73 = vfmsub231ps_fma(auVar109,auVar358,auVar66);
          auVar235._8_4_ = 0xc0000000;
          auVar235._0_8_ = 0xc0000000c0000000;
          auVar235._12_4_ = 0xc0000000;
          auVar235._16_4_ = 0xc0000000;
          auVar235._20_4_ = 0xc0000000;
          auVar235._24_4_ = 0xc0000000;
          auVar235._28_4_ = 0xc0000000;
          auVar151._0_4_ = auVar73._0_4_ * -2.0;
          auVar151._4_4_ = auVar73._4_4_ * -2.0;
          auVar151._8_4_ = auVar73._8_4_ * -2.0;
          auVar151._12_4_ = auVar73._12_4_ * -2.0;
          auVar151._16_4_ = 0x80000000;
          auVar151._20_4_ = 0x80000000;
          auVar151._24_4_ = 0x80000000;
          auVar151._28_4_ = 0;
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar186._16_4_ = 0x7fffffff;
          auVar186._20_4_ = 0x7fffffff;
          auVar186._24_4_ = 0x7fffffff;
          auVar186._28_4_ = 0x7fffffff;
          auVar64 = vblendvps_avx(auVar151,auVar186,auVar64);
          auVar152._8_4_ = 0x42b0c0a5;
          auVar152._0_8_ = 0x42b0c0a542b0c0a5;
          auVar152._12_4_ = 0x42b0c0a5;
          auVar152._16_4_ = 0x42b0c0a5;
          auVar152._20_4_ = 0x42b0c0a5;
          auVar152._24_4_ = 0x42b0c0a5;
          auVar152._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar64,auVar152);
          auVar66 = vmaxps_avx(auVar333,auVar64);
          auVar73 = vfmadd213ps_fma(auVar347,auVar66,auVar341);
          auVar109 = vroundps_avx(ZEXT1632(auVar73),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar73),auVar109,1);
          auVar64 = vandps_avx(auVar354,auVar64);
          auVar64 = vsubps_avx(auVar109,auVar64);
          auVar73 = vfmsub231ps_fma(auVar66,auVar64,auVar358);
          auVar110 = vfnmsub231ps_fma(ZEXT1632(auVar73),auVar64,auVar325);
          auVar66 = ZEXT1632(auVar110);
          auVar23._28_4_ = auVar109._28_4_;
          auVar23._0_28_ =
               ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                  CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                           CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                    auVar110._0_4_ * auVar110._0_4_))));
          auVar213._8_4_ = 0x39506967;
          auVar213._0_8_ = 0x3950696739506967;
          auVar213._12_4_ = 0x39506967;
          auVar213._16_4_ = 0x39506967;
          auVar213._20_4_ = 0x39506967;
          auVar213._24_4_ = 0x39506967;
          auVar213._28_4_ = 0x39506967;
          auVar73 = vfmadd213ps_fma(auVar213,auVar66,auVar362);
          auVar267._8_4_ = 0x3c088908;
          auVar267._0_8_ = 0x3c0889083c088908;
          auVar267._12_4_ = 0x3c088908;
          auVar267._16_4_ = 0x3c088908;
          auVar267._20_4_ = 0x3c088908;
          auVar267._24_4_ = 0x3c088908;
          auVar267._28_4_ = 0x3c088908;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar267);
          auVar268._8_4_ = 0x3d2aa9c1;
          auVar268._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar268._12_4_ = 0x3d2aa9c1;
          auVar268._16_4_ = 0x3d2aa9c1;
          auVar268._20_4_ = 0x3d2aa9c1;
          auVar268._24_4_ = 0x3d2aa9c1;
          auVar268._28_4_ = 0x3d2aa9c1;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar268);
          auVar269._8_4_ = 0x3e2aaaaa;
          auVar269._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar269._12_4_ = 0x3e2aaaaa;
          auVar269._16_4_ = 0x3e2aaaaa;
          auVar269._20_4_ = 0x3e2aaaaa;
          auVar269._24_4_ = 0x3e2aaaaa;
          auVar269._28_4_ = 0x3e2aaaaa;
          auVar66 = ZEXT1632(auVar110);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar269);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar66,auVar341);
          auVar192 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar23,auVar66);
          auVar110._0_4_ = (int)auVar64._0_4_;
          auVar110._4_4_ = (int)auVar64._4_4_;
          auVar110._8_4_ = (int)auVar64._8_4_;
          auVar110._12_4_ = (int)auVar64._12_4_;
          auVar102._16_4_ = (int)auVar64._16_4_;
          auVar102._0_16_ = auVar110;
          auVar102._20_4_ = (int)auVar64._20_4_;
          auVar102._24_4_ = (int)auVar64._24_4_;
          auVar102._28_4_ = (int)auVar64._28_4_;
          auVar110 = vpslld_avx(auVar110,0x17);
          auVar73 = vpslld_avx(auVar102._16_16_,0x17);
          auVar73 = vpaddd_avx(auVar73,auVar75);
          auVar110 = vpaddd_avx(auVar110,auVar75);
          auVar103._16_16_ = auVar73;
          auVar103._0_16_ = auVar110;
          auVar153._0_4_ = auVar192._0_4_ + 1.0;
          auVar153._4_4_ = auVar192._4_4_ + 1.0;
          auVar153._8_4_ = auVar192._8_4_ + 1.0;
          auVar153._12_4_ = auVar192._12_4_ + 1.0;
          auVar153._16_4_ = 0x3f800000;
          auVar153._20_4_ = 0x3f800000;
          auVar153._24_4_ = 0x3f800000;
          auVar153._28_4_ = 0x3f800000;
          auVar73 = vfmadd213ps_fma(auVar103,auVar153,auVar354);
          auVar64 = vrcpps_avx(ZEXT1632(auVar73));
          auVar73 = vfmsub213ps_fma(ZEXT1632(auVar73),auVar64,auVar354);
          auVar73 = vfnmadd132ps_fma(ZEXT1632(auVar73),auVar64,auVar64);
          auVar73 = vfnmadd213ps_fma(ZEXT1632(auVar73),auVar235,auVar295);
          auVar237 = ZEXT1664(auVar73);
          goto LAB_002f643e;
        case 6:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar109._4_4_ = uVar2;
          auVar109._0_4_ = uVar2;
          auVar109._8_4_ = uVar2;
          auVar109._12_4_ = uVar2;
          auVar109._16_4_ = uVar2;
          auVar109._20_4_ = uVar2;
          auVar109._24_4_ = uVar2;
          auVar109._28_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar157._4_4_ = uVar2;
          auVar157._0_4_ = uVar2;
          auVar157._8_4_ = uVar2;
          auVar157._12_4_ = uVar2;
          auVar157._16_4_ = uVar2;
          auVar157._20_4_ = uVar2;
          auVar157._24_4_ = uVar2;
          auVar157._28_4_ = uVar2;
          auVar73 = vfmadd231ps_fma(auVar157,auVar61,auVar109);
          auVar64 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(ZEXT816(0) << 0x40));
          auVar158._8_4_ = 0x3f800000;
          auVar158._0_8_ = 0x3f8000003f800000;
          auVar158._12_4_ = 0x3f800000;
          auVar158._16_4_ = 0x3f800000;
          auVar158._20_4_ = 0x3f800000;
          auVar158._24_4_ = 0x3f800000;
          auVar158._28_4_ = 0x3f800000;
          auVar64 = vminps_avx(auVar64,auVar158);
          auVar237 = ZEXT3264(auVar64);
LAB_002f643e:
          auVar363._0_4_ = auVar237._0_4_ * fVar49;
          auVar363._4_4_ = auVar237._4_4_ * fVar70;
          auVar363._8_4_ = auVar237._8_4_ * auVar61._8_4_;
          auVar363._12_4_ = auVar237._12_4_ * auVar61._12_4_;
          auVar363._16_4_ = auVar237._16_4_ * auVar61._16_4_;
          auVar363._20_4_ = auVar237._20_4_ * auVar61._20_4_;
          auVar363._28_36_ = auVar237._28_36_;
          auVar363._24_4_ = auVar237._24_4_ * auVar61._24_4_;
          auVar64 = auVar363._0_32_;
        }
switchD_002f5fd2_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + local_310 * 4) = auVar64;
        lVar44 = local_2d0 + 8;
        lVar47 = local_2d8 + 8;
        lVar34 = local_2e0 + 8;
        lVar36 = local_2e8 + 8;
        lVar39 = local_2f0 + 8;
        lVar42 = local_2f8 + 8;
        lVar45 = local_300 + 8;
        uVar33 = uVar33 + 8;
        uVar38 = local_308 + 1;
      }
      uVar33 = local_318 & 0xfffffffffffffff8;
      uVar28 = uVar28 >> 2 & 1;
      lVar44 = uVar33 + 3;
      local_138._0_8_ = uVar33 + 2;
      local_158._0_8_ = uVar33 + 1;
      local_1f8._0_8_ = uVar33;
      local_178._0_8_ = uVar33;
      uVar33 = 0;
      while (pauVar31 = local_388, uVar33 != uVar28) {
        uVar38 = local_1f8._0_8_ + uVar33 * 4;
        local_1b8._0_8_ = uVar33;
        if (lVar11 == 0) {
          auVar73 = ZEXT816(0) << 0x40;
        }
        else {
          auVar73 = *(undefined1 (*) [16])(lVar11 + uVar38 * 4);
        }
        pvVar12 = (this->weight_data_tm).data;
        sVar13 = (this->weight_data_tm).elemsize;
        lVar34 = (long)(this->weight_data_tm).w;
        lVar47 = sVar13 * lVar34;
        local_1d8._0_8_ = uVar38;
        pauVar43 = (undefined1 (*) [16])(lVar47 * uVar38 + (long)pvVar12);
        pauVar35 = (undefined1 (*) [16])((uVar38 | 1) * lVar47 + (long)pvVar12);
        pauVar37 = (undefined1 (*) [16])((uVar38 | 2) * lVar47 + (long)pvVar12);
        pauVar40 = (undefined1 (*) [16])(lVar47 * (uVar38 | 3) + (long)pvVar12);
        lVar36 = 0;
        auVar110 = ZEXT816(0) << 0x40;
        lVar47 = 0;
        auVar192 = ZEXT816(0) << 0x40;
        auVar240 = ZEXT816(0) << 0x40;
        auVar75 = ZEXT816(0) << 0x40;
        iVar46 = 0;
        pauVar41 = local_388;
        while( true ) {
          auVar238 = ZEXT1664(auVar75);
          auVar69 = ZEXT1664(auVar240);
          auVar363 = ZEXT1664(auVar192);
          auVar237 = ZEXT1664(auVar110);
          local_b8 = ZEXT1632(auVar110);
          local_d8 = ZEXT1632(auVar192);
          local_f8 = ZEXT1632(auVar240);
          local_118 = ZEXT1632(auVar75);
          if (iVar30 <= iVar46 + 7) break;
          auVar64 = *pauVar41;
          auVar110 = vlddqu_avx(*pauVar43);
          auVar66 = vcvtph2ps_f16c(auVar110);
          auVar110 = vlddqu_avx(*pauVar35);
          auVar61 = vcvtph2ps_f16c(auVar110);
          auVar110 = vlddqu_avx(*pauVar37);
          auVar109 = vcvtph2ps_f16c(auVar110);
          auVar110 = vlddqu_avx(*pauVar40);
          auVar157 = vcvtph2ps_f16c(auVar110);
          auVar110 = vfmadd231ps_fma(local_b8,auVar64,auVar66);
          auVar192 = vfmadd231ps_fma(local_d8,auVar64,auVar61);
          auVar240 = vfmadd231ps_fma(local_f8,auVar64,auVar109);
          auVar75 = vfmadd231ps_fma(local_118,auVar64,auVar157);
          pauVar41 = pauVar41 + 1;
          pauVar43 = pauVar43 + 1;
          pauVar35 = pauVar35 + 1;
          pauVar37 = pauVar37 + 1;
          pauVar40 = pauVar40 + 1;
          iVar46 = iVar46 + 8;
          lVar47 = lVar47 + 0x10;
          lVar36 = lVar36 + 8;
        }
        local_198._0_8_ = lVar44;
        lVar39 = sVar13 * lVar44 * lVar34;
        lVar42 = sVar13 * local_138._0_8_ * lVar34;
        lVar44 = sVar13 * local_158._0_8_ * lVar34;
        lVar34 = sVar13 * local_178._0_8_ * lVar34;
        local_278 = ZEXT816(0) << 0x40;
        local_288 = ZEXT816(0) << 0x40;
        local_298 = ZEXT816(0) << 0x40;
        local_2a8 = ZEXT816(0) << 0x40;
        for (; iVar46 + 3 < iVar30; iVar46 = iVar46 + 4) {
          auVar192._8_8_ = 0;
          auVar192._0_8_ = *(ulong *)((long)pvVar12 + lVar47 + lVar34);
          auVar192 = vcvtph2ps_f16c(auVar192);
          auVar329._8_8_ = 0;
          auVar329._0_8_ = *(ulong *)((long)pvVar12 + lVar47 + lVar44);
          auVar240 = vcvtph2ps_f16c(auVar329);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)((long)pvVar12 + lVar47 + lVar42);
          auVar75 = vcvtph2ps_f16c(auVar6);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)((long)pvVar12 + lVar47 + lVar39);
          auVar54 = vcvtph2ps_f16c(auVar7);
          auVar110 = *(undefined1 (*) [16])(*local_388 + lVar47 * 2);
          local_278 = vfmadd231ps_fma(local_278,auVar110,auVar192);
          local_288 = vfmadd231ps_fma(local_288,auVar110,auVar240);
          local_298 = vfmadd231ps_fma(local_298,auVar110,auVar75);
          local_2a8 = vfmadd231ps_fma(local_2a8,auVar110,auVar54);
          lVar47 = lVar47 + 8;
          lVar36 = lVar36 + 4;
        }
        for (; (int)lVar36 < iVar30; lVar36 = lVar36 + 1) {
          local_2c8._0_16_ = auVar73;
          local_328 = ZEXT416(*(uint *)(*pauVar31 + lVar36 * 4));
          fVar49 = float16_to_float32(*(unsigned_short *)((long)pvVar12 + lVar36 * 2 + lVar34));
          auVar64 = local_218;
          local_218._4_4_ = extraout_XMM0_Db_04;
          local_218._0_4_ = fVar49;
          local_218._8_4_ = extraout_XMM0_Dc_04;
          local_218._16_16_ = auVar64._16_16_;
          local_218._12_4_ = extraout_XMM0_Dd_04;
          local_338 = ZEXT416(*(uint *)(*pauVar31 + lVar36 * 4));
          local_238 = float16_to_float32(*(unsigned_short *)((long)pvVar12 + lVar36 * 2 + lVar44));
          local_248 = ZEXT416(*(uint *)(*pauVar31 + lVar36 * 4));
          local_258 = float16_to_float32(*(unsigned_short *)((long)pvVar12 + lVar36 * 2 + lVar42));
          local_268 = ZEXT416(*(uint *)(*pauVar31 + lVar36 * 4));
          auVar69._0_4_ =
               float16_to_float32(*(unsigned_short *)((long)pvVar12 + lVar36 * 2 + lVar39));
          auVar69._4_60_ = extraout_var_00;
          auVar73 = vinsertps_avx(local_218._0_16_,ZEXT416((uint)local_238),0x10);
          auVar73 = vinsertps_avx(auVar73,ZEXT416((uint)local_258),0x20);
          auVar73 = vinsertps_avx(auVar73,auVar69._0_16_,0x30);
          auVar110 = vinsertps_avx(local_328,ZEXT416((uint)local_338._0_4_),0x10);
          auVar110 = vinsertps_avx(auVar110,ZEXT416((uint)local_248._0_4_),0x20);
          auVar110 = vinsertps_avx(auVar110,ZEXT416((uint)local_268._0_4_),0x30);
          auVar73 = vfmadd231ps_fma(local_2c8._0_16_,auVar73,auVar110);
          auVar237 = ZEXT3264(local_b8);
          auVar363 = ZEXT3264(local_d8);
          auVar69 = ZEXT3264(local_f8);
          auVar238 = ZEXT3264(local_118);
        }
        auVar64 = vhaddps_avx(auVar237._0_32_,auVar363._0_32_);
        auVar66 = vhaddps_avx(auVar69._0_32_,auVar238._0_32_);
        auVar64 = vhaddps_avx(auVar64,auVar66);
        auVar192 = vunpcklps_avx(local_278,local_288);
        auVar240 = vunpcklps_avx(local_298,local_2a8);
        auVar75 = vunpckhps_avx(local_278,local_288);
        auVar54 = vunpckhps_avx(local_298,local_2a8);
        auVar110 = vmovlhps_avx(auVar192,auVar240);
        auVar240 = vunpckhpd_avx(auVar192,auVar240);
        auVar192 = vmovlhps_avx(auVar75,auVar54);
        auVar75 = vunpckhpd_avx(auVar75,auVar54);
        auVar55._0_4_ =
             auVar240._0_4_ + auVar110._0_4_ + auVar192._0_4_ + auVar75._0_4_ + auVar73._0_4_ +
             auVar64._0_4_ + auVar64._16_4_;
        auVar55._4_4_ =
             auVar240._4_4_ + auVar110._4_4_ + auVar192._4_4_ + auVar75._4_4_ + auVar73._4_4_ +
             auVar64._4_4_ + auVar64._20_4_;
        auVar55._8_4_ =
             auVar240._8_4_ + auVar110._8_4_ + auVar192._8_4_ + auVar75._8_4_ + auVar73._8_4_ +
             auVar64._8_4_ + auVar64._24_4_;
        auVar55._12_4_ =
             auVar240._12_4_ + auVar110._12_4_ + auVar192._12_4_ + auVar75._12_4_ + auVar73._12_4_ +
             auVar64._12_4_ + auVar64._28_4_;
        auVar87 = auVar55;
        if (iVar27 - 1U < 6) {
          auVar73 = ZEXT816(0) << 0x20;
          auVar87 = vmaxps_avx(auVar55,auVar73);
          switch(iVar27) {
          case 2:
            auVar73 = vminps_avx(auVar55,auVar73);
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
            auVar121._4_4_ = uVar2;
            auVar121._0_4_ = uVar2;
            auVar121._8_4_ = uVar2;
            auVar121._12_4_ = uVar2;
            auVar87 = vfmadd231ps_fma(auVar87,auVar73,auVar121);
            break;
          case 3:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
            auVar81._4_4_ = uVar2;
            auVar81._0_4_ = uVar2;
            auVar81._8_4_ = uVar2;
            auVar81._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
            auVar126._4_4_ = uVar2;
            auVar126._0_4_ = uVar2;
            auVar126._8_4_ = uVar2;
            auVar126._12_4_ = uVar2;
            auVar73 = vmaxps_avx(auVar55,auVar81);
            auVar87 = vminps_avx(auVar73,auVar126);
            break;
          case 4:
            uVar33 = CONCAT44(auVar55._4_4_,auVar55._0_4_);
            auVar56._0_8_ = uVar33 ^ 0x8000000080000000;
            auVar56._8_4_ = -auVar55._8_4_;
            auVar56._12_4_ = -auVar55._12_4_;
            auVar82._8_4_ = 0x42b0c0a5;
            auVar82._0_8_ = 0x42b0c0a542b0c0a5;
            auVar82._12_4_ = 0x42b0c0a5;
            auVar73 = vminps_avx(auVar56,auVar82);
            auVar83._8_4_ = 0xc2b0c0a5;
            auVar83._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar83._12_4_ = 0xc2b0c0a5;
            auVar192 = vmaxps_avx(auVar73,auVar83);
            auVar84._8_4_ = 0x3fb8aa3b;
            auVar84._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar84._12_4_ = 0x3fb8aa3b;
            auVar226._8_4_ = 0x3f000000;
            auVar226._0_8_ = 0x3f0000003f000000;
            auVar226._12_4_ = 0x3f000000;
            auVar73 = vfmadd213ps_fma(auVar84,auVar192,auVar226);
            auVar127._0_4_ = (int)auVar73._0_4_;
            auVar127._4_4_ = (int)auVar73._4_4_;
            auVar127._8_4_ = (int)auVar73._8_4_;
            auVar127._12_4_ = (int)auVar73._12_4_;
            auVar110 = vcvtdq2ps_avx(auVar127);
            auVar73 = vcmpps_avx(auVar73,auVar110,1);
            auVar204._8_4_ = 0x3f800000;
            auVar204._0_8_ = 0x3f8000003f800000;
            auVar204._12_4_ = 0x3f800000;
            auVar73 = vandps_avx(auVar73,auVar204);
            auVar73 = vsubps_avx(auVar110,auVar73);
            auVar128._8_4_ = 0x3f318000;
            auVar128._0_8_ = 0x3f3180003f318000;
            auVar128._12_4_ = 0x3f318000;
            auVar110 = vfmsub231ps_fma(auVar192,auVar73,auVar128);
            auVar129._8_4_ = 0x395e8083;
            auVar129._0_8_ = 0x395e8083395e8083;
            auVar129._12_4_ = 0x395e8083;
            auVar192 = vfmsub231ps_fma(auVar110,auVar73,auVar129);
            auVar130._0_4_ = auVar192._0_4_ * auVar192._0_4_;
            auVar130._4_4_ = auVar192._4_4_ * auVar192._4_4_;
            auVar130._8_4_ = auVar192._8_4_ * auVar192._8_4_;
            auVar130._12_4_ = auVar192._12_4_ * auVar192._12_4_;
            auVar179._8_4_ = 0x39506967;
            auVar179._0_8_ = 0x3950696739506967;
            auVar179._12_4_ = 0x39506967;
            auVar249._8_4_ = 0x3ab743ce;
            auVar249._0_8_ = 0x3ab743ce3ab743ce;
            auVar249._12_4_ = 0x3ab743ce;
            auVar110 = vfmadd213ps_fma(auVar179,auVar192,auVar249);
            auVar250._8_4_ = 0x3c088908;
            auVar250._0_8_ = 0x3c0889083c088908;
            auVar250._12_4_ = 0x3c088908;
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar250);
            auVar251._8_4_ = 0x3d2aa9c1;
            auVar251._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar251._12_4_ = 0x3d2aa9c1;
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar251);
            auVar252._8_4_ = 0x3e2aaaaa;
            auVar252._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar252._12_4_ = 0x3e2aaaaa;
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar252);
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar226);
            auVar110 = vfmadd213ps_fma(auVar110,auVar130,auVar192);
            auVar57._0_4_ = auVar110._0_4_ + 1.0;
            auVar57._4_4_ = auVar110._4_4_ + 1.0;
            auVar57._8_4_ = auVar110._8_4_ + 1.0;
            auVar57._12_4_ = auVar110._12_4_ + 1.0;
            auVar85._0_4_ = (int)auVar73._0_4_;
            auVar85._4_4_ = (int)auVar73._4_4_;
            auVar85._8_4_ = (int)auVar73._8_4_;
            auVar85._12_4_ = (int)auVar73._12_4_;
            auVar73 = vpslld_avx(auVar85,0x17);
            auVar73 = vpaddd_avx(auVar73,auVar204);
            auVar110 = vfmadd213ps_fma(auVar73,auVar57,auVar204);
            auVar73 = vrcpps_avx(auVar110);
            auVar110 = vfmsub213ps_fma(auVar110,auVar73,auVar204);
            auVar87 = vfnmadd132ps_fma(auVar110,auVar73,auVar73);
            break;
          case 5:
            auVar289._8_4_ = 0x42b0c0a5;
            auVar289._0_8_ = 0x42b0c0a542b0c0a5;
            auVar289._12_4_ = 0x42b0c0a5;
            auVar73 = vminps_avx(auVar289,auVar55);
            auVar306._8_4_ = 0xc2b0c0a5;
            auVar306._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar306._12_4_ = 0xc2b0c0a5;
            auVar192 = vmaxps_avx(auVar306,auVar73);
            auVar330._8_4_ = 0x3fb8aa3b;
            auVar330._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar330._12_4_ = 0x3fb8aa3b;
            auVar336._8_4_ = 0x3f000000;
            auVar336._0_8_ = 0x3f0000003f000000;
            auVar336._12_4_ = 0x3f000000;
            auVar73 = vfmadd213ps_fma(auVar330,auVar192,auVar336);
            auVar171._0_4_ = (int)auVar73._0_4_;
            auVar171._4_4_ = (int)auVar73._4_4_;
            auVar171._8_4_ = (int)auVar73._8_4_;
            auVar171._12_4_ = (int)auVar73._12_4_;
            auVar110 = vcvtdq2ps_avx(auVar171);
            auVar73 = vcmpps_avx(auVar73,auVar110,1);
            auVar281._8_4_ = 0x3f800000;
            auVar281._0_8_ = 0x3f8000003f800000;
            auVar281._12_4_ = 0x3f800000;
            auVar73 = vandps_avx(auVar73,auVar281);
            auVar73 = vsubps_avx(auVar110,auVar73);
            auVar343._8_4_ = 0x3f318000;
            auVar343._0_8_ = 0x3f3180003f318000;
            auVar343._12_4_ = 0x3f318000;
            auVar110 = vfmsub231ps_fma(auVar192,auVar73,auVar343);
            auVar290._8_4_ = 0xb95e8083;
            auVar290._0_8_ = 0xb95e8083b95e8083;
            auVar290._12_4_ = 0xb95e8083;
            auVar192 = vfnmsub231ps_fma(auVar110,auVar73,auVar290);
            auVar172._0_4_ = auVar192._0_4_ * auVar192._0_4_;
            auVar172._4_4_ = auVar192._4_4_ * auVar192._4_4_;
            auVar172._8_4_ = auVar192._8_4_ * auVar192._8_4_;
            auVar172._12_4_ = auVar192._12_4_ * auVar192._12_4_;
            auVar356._8_4_ = 0x39506967;
            auVar356._0_8_ = 0x3950696739506967;
            auVar356._12_4_ = 0x39506967;
            auVar349._8_4_ = 0x3ab743ce;
            auVar349._0_8_ = 0x3ab743ce3ab743ce;
            auVar349._12_4_ = 0x3ab743ce;
            auVar110 = vfmadd213ps_fma(auVar356,auVar192,auVar349);
            auVar360._8_4_ = 0x3c088908;
            auVar360._0_8_ = 0x3c0889083c088908;
            auVar360._12_4_ = 0x3c088908;
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar360);
            auVar220._8_4_ = 0x3d2aa9c1;
            auVar220._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar220._12_4_ = 0x3d2aa9c1;
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar220);
            auVar221._8_4_ = 0x3e2aaaaa;
            auVar221._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar221._12_4_ = 0x3e2aaaaa;
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar221);
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar336);
            auVar110 = vfmadd213ps_fma(auVar110,auVar172,auVar192);
            auVar173._0_4_ = auVar110._0_4_ + 1.0;
            auVar173._4_4_ = auVar110._4_4_ + 1.0;
            auVar173._8_4_ = auVar110._8_4_ + 1.0;
            auVar173._12_4_ = auVar110._12_4_ + 1.0;
            auVar79._0_4_ = (int)auVar73._0_4_;
            auVar79._4_4_ = (int)auVar73._4_4_;
            auVar79._8_4_ = (int)auVar73._8_4_;
            auVar79._12_4_ = (int)auVar73._12_4_;
            auVar73 = vpslld_avx(auVar79,0x17);
            auVar73 = vpaddd_avx(auVar73,auVar281);
            auVar75 = vfmadd213ps_fma(auVar73,auVar173,auVar281);
            auVar122._8_4_ = 0x800000;
            auVar122._0_8_ = 0x80000000800000;
            auVar122._12_4_ = 0x800000;
            auVar73 = vmaxps_avx(auVar75,auVar122);
            auVar110 = vpsrld_avx(auVar73,0x17);
            auVar199._8_4_ = 0xffffff82;
            auVar199._0_8_ = 0xffffff82ffffff82;
            auVar199._12_4_ = 0xffffff82;
            auVar110 = vpaddd_avx(auVar110,auVar199);
            auVar200._8_4_ = 0x807fffff;
            auVar200._0_8_ = 0x807fffff807fffff;
            auVar200._12_4_ = 0x807fffff;
            auVar73 = vandps_avx(auVar73,auVar200);
            auVar240 = vorps_avx(auVar336,auVar73);
            auVar192 = vcvtdq2ps_avx(auVar110);
            auVar201._8_4_ = 0x3f3504f3;
            auVar201._0_8_ = 0x3f3504f33f3504f3;
            auVar201._12_4_ = 0x3f3504f3;
            auVar110 = vcmpps_avx(auVar240,auVar201,1);
            auVar73 = vandps_avx(auVar110,auVar240);
            auVar123._0_4_ = auVar240._0_4_ + -1.0 + auVar73._0_4_;
            auVar123._4_4_ = auVar240._4_4_ + -1.0 + auVar73._4_4_;
            auVar123._8_4_ = auVar240._8_4_ + -1.0 + auVar73._8_4_;
            auVar123._12_4_ = auVar240._12_4_ + -1.0 + auVar73._12_4_;
            auVar73 = vandps_avx(auVar110,auVar281);
            auVar110 = vsubps_avx(auVar192,auVar73);
            auVar202._0_4_ = auVar123._0_4_ * auVar123._0_4_;
            auVar202._4_4_ = auVar123._4_4_ * auVar123._4_4_;
            auVar202._8_4_ = auVar123._8_4_ * auVar123._8_4_;
            auVar202._12_4_ = auVar123._12_4_ * auVar123._12_4_;
            auVar222._8_4_ = 0x3d9021bb;
            auVar222._0_8_ = 0x3d9021bb3d9021bb;
            auVar222._12_4_ = 0x3d9021bb;
            auVar241._8_4_ = 0xbdebd1b8;
            auVar241._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar241._12_4_ = 0xbdebd1b8;
            auVar73 = vfmadd213ps_fma(auVar222,auVar123,auVar241);
            auVar242._8_4_ = 0x3def251a;
            auVar242._0_8_ = 0x3def251a3def251a;
            auVar242._12_4_ = 0x3def251a;
            auVar73 = vfmadd213ps_fma(auVar73,auVar123,auVar242);
            auVar243._8_4_ = 0xbdfe5d4f;
            auVar243._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar243._12_4_ = 0xbdfe5d4f;
            auVar73 = vfmadd213ps_fma(auVar73,auVar123,auVar243);
            auVar244._8_4_ = 0x3e11e9bf;
            auVar244._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar244._12_4_ = 0x3e11e9bf;
            auVar73 = vfmadd213ps_fma(auVar73,auVar123,auVar244);
            auVar245._8_4_ = 0xbe2aae50;
            auVar245._0_8_ = 0xbe2aae50be2aae50;
            auVar245._12_4_ = 0xbe2aae50;
            auVar73 = vfmadd213ps_fma(auVar73,auVar123,auVar245);
            auVar246._8_4_ = 0x3e4cceac;
            auVar246._0_8_ = 0x3e4cceac3e4cceac;
            auVar246._12_4_ = 0x3e4cceac;
            auVar73 = vfmadd213ps_fma(auVar73,auVar123,auVar246);
            auVar247._8_4_ = 0xbe7ffffc;
            auVar247._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar247._12_4_ = 0xbe7ffffc;
            auVar73 = vfmadd213ps_fma(auVar73,auVar123,auVar247);
            auVar248._8_4_ = 0x3eaaaaaa;
            auVar248._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar248._12_4_ = 0x3eaaaaaa;
            auVar73 = vfmadd213ps_fma(auVar73,auVar123,auVar248);
            auVar223._0_4_ = auVar202._0_4_ * auVar123._0_4_ * auVar73._0_4_;
            auVar223._4_4_ = auVar202._4_4_ * auVar123._4_4_ * auVar73._4_4_;
            auVar223._8_4_ = auVar202._8_4_ * auVar123._8_4_ * auVar73._8_4_;
            auVar223._12_4_ = auVar202._12_4_ * auVar123._12_4_ * auVar73._12_4_;
            auVar25._12_4_ = 0;
            auVar25._0_12_ = ZEXT412(0);
            auVar73 = vfmadd231ps_fma(auVar223,auVar110,auVar290);
            auVar192 = vfmsub231ps_fma(auVar73,auVar336,auVar202);
            auVar73 = vcmpps_avx(auVar75,auVar25 << 0x20,2);
            auVar192 = vsubps_avx(auVar192,auVar123);
            auVar110 = vfnmadd231ps_fma(auVar192,auVar343,auVar110);
            auVar124._0_4_ = auVar110._0_4_ + auVar110._0_4_;
            auVar124._4_4_ = auVar110._4_4_ + auVar110._4_4_;
            auVar124._8_4_ = auVar110._8_4_ + auVar110._8_4_;
            auVar124._12_4_ = auVar110._12_4_ + auVar110._12_4_;
            auVar174._8_4_ = 0x7fffffff;
            auVar174._0_8_ = 0x7fffffff7fffffff;
            auVar174._12_4_ = 0x7fffffff;
            auVar73 = vblendvps_avx(auVar124,auVar174,auVar73);
            auVar125._8_4_ = 0x42b0c0a5;
            auVar125._0_8_ = 0x42b0c0a542b0c0a5;
            auVar125._12_4_ = 0x42b0c0a5;
            auVar73 = vminps_avx(auVar73,auVar125);
            auVar192 = vmaxps_avx(auVar306,auVar73);
            auVar73 = vfmadd213ps_fma(auVar330,auVar192,auVar336);
            auVar175._0_4_ = (int)auVar73._0_4_;
            auVar175._4_4_ = (int)auVar73._4_4_;
            auVar175._8_4_ = (int)auVar73._8_4_;
            auVar175._12_4_ = (int)auVar73._12_4_;
            auVar110 = vcvtdq2ps_avx(auVar175);
            auVar73 = vcmpps_avx(auVar73,auVar110,1);
            auVar73 = vandps_avx(auVar73,auVar281);
            auVar73 = vsubps_avx(auVar110,auVar73);
            auVar110 = vfmsub231ps_fma(auVar192,auVar73,auVar343);
            auVar192 = vfnmsub231ps_fma(auVar110,auVar73,auVar290);
            auVar176._0_4_ = auVar192._0_4_ * auVar192._0_4_;
            auVar176._4_4_ = auVar192._4_4_ * auVar192._4_4_;
            auVar176._8_4_ = auVar192._8_4_ * auVar192._8_4_;
            auVar176._12_4_ = auVar192._12_4_ * auVar192._12_4_;
            auVar110 = vfmadd213ps_fma(auVar356,auVar192,auVar349);
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar360);
            auVar224._8_4_ = 0x3d2aa9c1;
            auVar224._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar224._12_4_ = 0x3d2aa9c1;
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar224);
            auVar225._8_4_ = 0x3e2aaaaa;
            auVar225._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar225._12_4_ = 0x3e2aaaaa;
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar225);
            auVar110 = vfmadd213ps_fma(auVar110,auVar192,auVar336);
            auVar110 = vfmadd213ps_fma(auVar110,auVar176,auVar192);
            auVar177._0_4_ = auVar110._0_4_ + 1.0;
            auVar177._4_4_ = auVar110._4_4_ + 1.0;
            auVar177._8_4_ = auVar110._8_4_ + 1.0;
            auVar177._12_4_ = auVar110._12_4_ + 1.0;
            auVar80._0_4_ = (int)auVar73._0_4_;
            auVar80._4_4_ = (int)auVar73._4_4_;
            auVar80._8_4_ = (int)auVar73._8_4_;
            auVar80._12_4_ = (int)auVar73._12_4_;
            auVar73 = vpslld_avx(auVar80,0x17);
            auVar73 = vpaddd_avx(auVar73,auVar281);
            auVar110 = vfmadd213ps_fma(auVar73,auVar177,auVar281);
            auVar73 = vrcpps_avx(auVar110);
            auVar178._0_4_ = auVar73._0_4_ + auVar73._0_4_;
            auVar178._4_4_ = auVar73._4_4_ + auVar73._4_4_;
            auVar178._8_4_ = auVar73._8_4_ + auVar73._8_4_;
            auVar178._12_4_ = auVar73._12_4_ + auVar73._12_4_;
            auVar203._8_4_ = 0x40000000;
            auVar203._0_8_ = 0x4000000040000000;
            auVar203._12_4_ = 0x40000000;
            auVar110 = vfmsub213ps_fma(auVar110,auVar178,auVar203);
            auVar73 = vfnmadd213ps_fma(auVar110,auVar73,auVar178);
            auVar87 = vfmsub213ps_fma(auVar73,auVar55,auVar55);
            break;
          case 6:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
            auVar86._4_4_ = uVar2;
            auVar86._0_4_ = uVar2;
            auVar86._8_4_ = uVar2;
            auVar86._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
            auVar131._4_4_ = uVar2;
            auVar131._0_4_ = uVar2;
            auVar131._8_4_ = uVar2;
            auVar131._12_4_ = uVar2;
            auVar110 = vfmadd231ps_fma(auVar131,auVar55,auVar86);
            auVar73 = vmaxps_avx(auVar110,auVar73);
            auVar132._8_4_ = 0x3f800000;
            auVar132._0_8_ = 0x3f8000003f800000;
            auVar132._12_4_ = 0x3f800000;
            auVar73 = vminps_avx(auVar73,auVar132);
            auVar87._0_4_ = auVar73._0_4_ * auVar55._0_4_;
            auVar87._4_4_ = auVar73._4_4_ * auVar55._4_4_;
            auVar87._8_4_ = auVar73._8_4_ * auVar55._8_4_;
            auVar87._12_4_ = auVar73._12_4_ * auVar55._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + local_1d8._0_8_ * 4) = auVar87;
        lVar44 = local_198._0_8_ + 4;
        local_138._0_8_ = local_138._0_8_ + 4;
        local_158._0_8_ = local_158._0_8_ + 4;
        local_178._0_8_ = local_178._0_8_ + 4;
        uVar33 = local_1b8._0_8_ + 1;
      }
      for (lVar44 = (long)(int)(local_1f8._0_4_ + uVar28 * 4); pauVar31 = local_388,
          lVar44 < (long)local_318; lVar44 = lVar44 + 1) {
        if (lVar11 == 0) {
          auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
        }
        else {
          auVar237 = ZEXT464(*(uint *)(lVar11 + lVar44 * 4));
        }
        pvVar12 = (this->weight_data_tm).data;
        sVar13 = (this->weight_data_tm).elemsize;
        lVar47 = (long)(this->weight_data_tm).w;
        pauVar35 = (undefined1 (*) [16])(lVar44 * lVar47 * sVar13 + (long)pvVar12);
        auVar73 = ZEXT816(0) << 0x40;
        lVar34 = 0;
        iVar46 = 0;
        pauVar41 = local_388;
        while( true ) {
          auVar363 = ZEXT1664(auVar73);
          local_218 = ZEXT1632(auVar73);
          if (iVar30 <= iVar46 + 7) break;
          auVar73 = vlddqu_avx(*pauVar35);
          auVar64 = vcvtph2ps_f16c(auVar73);
          auVar73 = vfmadd231ps_fma(local_218,auVar64,*pauVar41);
          pauVar41 = pauVar41 + 1;
          pauVar35 = pauVar35 + 1;
          iVar46 = iVar46 + 8;
          lVar34 = lVar34 + 8;
        }
        local_338 = ZEXT816(0) << 0x40;
        for (; iVar46 + 3 < iVar30; iVar46 = iVar46 + 4) {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)*pauVar35;
          auVar73 = vcvtph2ps_f16c(auVar8);
          local_338 = vfmadd231ps_fma(local_338,auVar73,*(undefined1 (*) [16])*pauVar41);
          pauVar41 = (undefined1 (*) [32])(*pauVar41 + 0x10);
          pauVar35 = (undefined1 (*) [16])(*pauVar35 + 8);
          lVar34 = lVar34 + 4;
        }
        while( true ) {
          if (iVar30 <= (int)lVar34) break;
          local_2c8._0_4_ = auVar237._0_4_;
          local_328._0_4_ = *(undefined4 *)(*pauVar31 + lVar34 * 4);
          auVar238._0_4_ =
               float16_to_float32(*(unsigned_short *)
                                   ((long)pvVar12 + lVar34 * 2 + sVar13 * lVar44 * lVar47));
          auVar238._4_60_ = extraout_var_01;
          auVar73 = vfmadd231ss_fma(ZEXT416((uint)local_2c8._0_4_),auVar238._0_16_,
                                    ZEXT416((uint)local_328._0_4_));
          auVar237 = ZEXT1664(auVar73);
          lVar34 = lVar34 + 1;
          auVar363 = ZEXT3264(local_218);
        }
        auVar73 = vshufpd_avx(local_338,local_338,1);
        auVar88._0_4_ = auVar73._0_4_ + local_338._0_4_;
        auVar88._4_4_ = auVar73._4_4_ + local_338._4_4_;
        auVar88._8_4_ = auVar73._8_4_ + local_338._8_4_;
        auVar88._12_4_ = auVar73._12_4_ + local_338._12_4_;
        auVar73 = vhaddps_avx(auVar363._16_16_,auVar363._0_16_);
        auVar110 = vmovshdup_avx(auVar88);
        auVar73 = vhaddps_avx(auVar73,auVar73);
        auVar73 = vhaddps_avx(auVar73,auVar73);
        fVar49 = auVar73._0_4_ + auVar110._0_4_ + auVar88._0_4_ + auVar237._0_4_;
        auVar73 = ZEXT416((uint)fVar49);
        fVar70 = fVar49;
        if (iVar27 - 1U < 6) {
          switch(iVar27) {
          case 1:
            auVar73 = vmaxss_avx(ZEXT416((uint)fVar49),ZEXT416(0));
            fVar70 = auVar73._0_4_;
            break;
          case 2:
            auVar58._0_12_ = ZEXT812(0);
            auVar58._12_4_ = 0;
            auVar73 = vcmpss_avx(auVar58,ZEXT416((uint)fVar49),1);
            auVar134._8_4_ = 0x3f800000;
            auVar134._0_8_ = 0x3f8000003f800000;
            auVar134._12_4_ = 0x3f800000;
            auVar73 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var9)),auVar134,
                                    auVar73);
            fVar70 = auVar73._0_4_ * fVar49;
            break;
          case 3:
            fVar49 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var9))[1];
            auVar73 = vmaxss_avx(auVar73,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var9)));
            fVar70 = auVar73._0_4_;
            if (fVar49 < auVar73._0_4_) {
              fVar70 = fVar49;
            }
            break;
          case 4:
            auVar73 = vminss_avx(auVar73,ZEXT416(0x42b0c0a5));
            auVar89._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
            auVar89._8_4_ = auVar73._8_4_ ^ 0x80000000;
            auVar89._12_4_ = auVar73._12_4_ ^ 0x80000000;
            auVar73 = vcmpss_avx(auVar73,ZEXT416(0xc2b0c0a5),1);
            auVar133._8_4_ = 0x42b0c0a5;
            auVar133._0_8_ = 0x42b0c0a542b0c0a5;
            auVar133._12_4_ = 0x42b0c0a5;
            auVar73 = vblendvps_avx(auVar89,auVar133,auVar73);
            fVar49 = expf(auVar73._0_4_);
            fVar70 = 1.0 / (fVar49 + 1.0);
            break;
          case 5:
            local_2c8._0_4_ = fVar49;
            fVar49 = expf(fVar49);
            fVar49 = logf(fVar49 + 1.0);
            fVar49 = tanhf(fVar49);
            fVar70 = fVar49 * (float)local_2c8._0_4_;
            break;
          case 6:
            fVar3 = **(float **)(&this->field_0xe8 + (long)p_Var9);
            fVar4 = (*(float **)(&this->field_0xe8 + (long)p_Var9))[1];
            fVar159 = -fVar4 / fVar3;
            fVar70 = 0.0;
            if ((fVar159 <= fVar49) && (fVar70 = fVar49, fVar49 <= fVar159 + 1.0 / fVar3)) {
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar73,ZEXT416((uint)fVar4));
              fVar70 = auVar73._0_4_ * fVar49;
            }
          }
        }
        *(float *)((long)top_blob->data + lVar44 * 4) = fVar70;
      }
    }
    else if (_elempack == 4) {
      p_Var9 = this->_vptr_InnerProduct_x86_fma[-3];
      iVar27 = *(int *)(&this->field_0xe0 + (long)p_Var9);
      iVar30 = local_370 * local_35c;
      lVar11 = *(long *)(&this->field_0x178 + (long)p_Var9);
      uVar33 = (ulong)(uint)top_blob->w;
      if (top_blob->w < 1) {
        uVar33 = 0;
      }
      auVar237 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar363 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      for (uVar38 = 0; uVar38 != uVar33; uVar38 = uVar38 + 1) {
        if (lVar11 == 0) {
          auVar73 = ZEXT816(0) << 0x40;
        }
        else {
          auVar73 = *(undefined1 (*) [16])(lVar11 + uVar38 * 0x10);
        }
        pvVar12 = (this->weight_data_tm).data;
        sVar13 = (this->weight_data_tm).elemsize;
        lVar47 = (long)(this->weight_data_tm).w;
        pauVar41 = (undefined1 (*) [32])(uVar38 * lVar47 * sVar13 + (long)pvVar12);
        auVar75 = ZEXT816(0) << 0x40;
        lVar44 = 0;
        auVar240 = ZEXT816(0) << 0x40;
        auVar192 = ZEXT816(0) << 0x40;
        auVar110 = ZEXT816(0) << 0x40;
        pauVar31 = local_388;
        for (iVar46 = 0; iVar46 + 7 < iVar30; iVar46 = iVar46 + 8) {
          uVar2 = *(undefined4 *)*pauVar31;
          auVar209._4_4_ = uVar2;
          auVar209._0_4_ = uVar2;
          auVar209._8_4_ = uVar2;
          auVar209._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar31 + 4);
          auVar209._20_4_ = uVar2;
          auVar209._16_4_ = uVar2;
          auVar209._24_4_ = uVar2;
          auVar209._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar31 + 8);
          auVar323._4_4_ = uVar2;
          auVar323._0_4_ = uVar2;
          auVar323._8_4_ = uVar2;
          auVar323._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar31 + 0xc);
          auVar323._20_4_ = uVar2;
          auVar323._16_4_ = uVar2;
          auVar323._24_4_ = uVar2;
          auVar323._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar31 + 0x10);
          auVar340._4_4_ = uVar2;
          auVar340._0_4_ = uVar2;
          auVar340._8_4_ = uVar2;
          auVar340._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar31 + 0x14);
          auVar340._20_4_ = uVar2;
          auVar340._16_4_ = uVar2;
          auVar340._24_4_ = uVar2;
          auVar340._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar31 + 0x18);
          auVar346._4_4_ = uVar2;
          auVar346._0_4_ = uVar2;
          auVar346._8_4_ = uVar2;
          auVar346._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar31 + 0x1c);
          auVar346._20_4_ = uVar2;
          auVar346._16_4_ = uVar2;
          auVar346._24_4_ = uVar2;
          auVar346._28_4_ = uVar2;
          auVar64 = vlddqu_avx(*pauVar41);
          auVar66 = vlddqu_avx(pauVar41[1]);
          auVar61 = vcvtph2ps_f16c(auVar64._0_16_);
          auVar64 = vcvtph2ps_f16c(auVar64._16_16_);
          auVar109 = vcvtph2ps_f16c(auVar66._0_16_);
          auVar66 = vcvtph2ps_f16c(auVar66._16_16_);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar209,auVar61);
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar323,auVar64);
          auVar240 = vfmadd231ps_fma(ZEXT1632(auVar240),auVar340,auVar109);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar346,auVar66);
          pauVar31 = pauVar31 + 1;
          pauVar41 = pauVar41 + 2;
          lVar44 = lVar44 + 8;
        }
        for (; iVar46 + 3 < iVar30; iVar46 = iVar46 + 4) {
          uVar2 = *(undefined4 *)*pauVar31;
          auVar210._4_4_ = uVar2;
          auVar210._0_4_ = uVar2;
          auVar210._8_4_ = uVar2;
          auVar210._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar31 + 4);
          auVar210._20_4_ = uVar2;
          auVar210._16_4_ = uVar2;
          auVar210._24_4_ = uVar2;
          auVar210._28_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar31 + 8);
          auVar283._4_4_ = uVar2;
          auVar283._0_4_ = uVar2;
          auVar283._8_4_ = uVar2;
          auVar283._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(*pauVar31 + 0xc);
          auVar283._20_4_ = uVar2;
          auVar283._16_4_ = uVar2;
          auVar283._24_4_ = uVar2;
          auVar283._28_4_ = uVar2;
          auVar64 = vlddqu_avx(*pauVar41);
          auVar66 = vcvtph2ps_f16c(auVar64._0_16_);
          auVar64 = vcvtph2ps_f16c(auVar64._16_16_);
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar210,auVar66);
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar283,auVar64);
          pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
          pauVar41 = pauVar41 + 1;
          lVar44 = lVar44 + 4;
        }
        for (; (int)lVar44 < iVar30; lVar44 = lVar44 + 1) {
          uVar2 = *(undefined4 *)(*local_388 + lVar44 * 4);
          auVar188._4_4_ = uVar2;
          auVar188._0_4_ = uVar2;
          auVar188._8_4_ = uVar2;
          auVar188._12_4_ = uVar2;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)((long)pvVar12 + lVar44 * 8 + sVar13 * uVar38 * lVar47);
          auVar54 = vcvtph2ps_f16c(auVar5);
          auVar73 = vfmadd231ps_fma(auVar73,auVar188,auVar54);
        }
        auVar76._0_4_ =
             auVar73._0_4_ + auVar240._0_4_ + auVar75._0_4_ + auVar192._0_4_ + auVar110._0_4_ + 0.0;
        auVar76._4_4_ =
             auVar73._4_4_ + auVar240._4_4_ + auVar75._4_4_ + auVar192._4_4_ + auVar110._4_4_ + 0.0;
        auVar76._8_4_ =
             auVar73._8_4_ + auVar240._8_4_ + auVar75._8_4_ + auVar192._8_4_ + auVar110._8_4_ + 0.0;
        auVar76._12_4_ =
             auVar73._12_4_ + auVar240._12_4_ + auVar75._12_4_ + auVar192._12_4_ + auVar110._12_4_ +
             0.0;
        auVar120 = auVar76;
        if (iVar27 - 1U < 6) {
          auVar73 = auVar237._0_16_;
          auVar120 = vmaxps_avx(auVar76,auVar73);
          auVar110 = auVar363._0_16_;
          fVar49 = auVar363._0_4_;
          fVar70 = auVar363._4_4_;
          fVar3 = auVar363._8_4_;
          fVar4 = auVar363._12_4_;
          switch(iVar27) {
          case 2:
            auVar73 = vminps_avx(auVar76,auVar73);
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
            auVar160._4_4_ = uVar2;
            auVar160._0_4_ = uVar2;
            auVar160._8_4_ = uVar2;
            auVar160._12_4_ = uVar2;
            auVar120 = vfmadd231ps_fma(auVar120,auVar73,auVar160);
            break;
          case 3:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
            auVar114._4_4_ = uVar2;
            auVar114._0_4_ = uVar2;
            auVar114._8_4_ = uVar2;
            auVar114._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
            auVar165._4_4_ = uVar2;
            auVar165._0_4_ = uVar2;
            auVar165._8_4_ = uVar2;
            auVar165._12_4_ = uVar2;
            auVar73 = vmaxps_avx(auVar76,auVar114);
            auVar120 = vminps_avx(auVar73,auVar165);
            break;
          case 4:
            uVar26 = CONCAT44(auVar76._4_4_,auVar76._0_4_);
            auVar77._0_8_ = uVar26 ^ 0x8000000080000000;
            auVar77._8_4_ = -auVar76._8_4_;
            auVar77._12_4_ = -auVar76._12_4_;
            auVar115._8_4_ = 0x42b0c0a5;
            auVar115._0_8_ = 0x42b0c0a542b0c0a5;
            auVar115._12_4_ = 0x42b0c0a5;
            auVar73 = vminps_avx(auVar77,auVar115);
            auVar116._8_4_ = 0xc2b0c0a5;
            auVar116._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar116._12_4_ = 0xc2b0c0a5;
            auVar240 = vmaxps_avx(auVar73,auVar116);
            auVar117._8_4_ = 0x3fb8aa3b;
            auVar117._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar117._12_4_ = 0x3fb8aa3b;
            auVar53._8_4_ = 0x3f000000;
            auVar53._0_8_ = 0x3f0000003f000000;
            auVar53._12_4_ = 0x3f000000;
            auVar73 = vfmadd213ps_fma(auVar117,auVar240,auVar53);
            auVar166._0_4_ = (int)auVar73._0_4_;
            auVar166._4_4_ = (int)auVar73._4_4_;
            auVar166._8_4_ = (int)auVar73._8_4_;
            auVar166._12_4_ = (int)auVar73._12_4_;
            auVar192 = vcvtdq2ps_avx(auVar166);
            auVar73 = vcmpps_avx(auVar73,auVar192,1);
            auVar73 = vandps_avx(auVar73,auVar110);
            auVar73 = vsubps_avx(auVar192,auVar73);
            auVar167._8_4_ = 0x3f318000;
            auVar167._0_8_ = 0x3f3180003f318000;
            auVar167._12_4_ = 0x3f318000;
            auVar192 = vfmsub231ps_fma(auVar240,auVar73,auVar167);
            auVar168._8_4_ = 0x395e8083;
            auVar168._0_8_ = 0x395e8083395e8083;
            auVar168._12_4_ = 0x395e8083;
            auVar240 = vfmsub231ps_fma(auVar192,auVar73,auVar168);
            auVar169._0_4_ = auVar240._0_4_ * auVar240._0_4_;
            auVar169._4_4_ = auVar240._4_4_ * auVar240._4_4_;
            auVar169._8_4_ = auVar240._8_4_ * auVar240._8_4_;
            auVar169._12_4_ = auVar240._12_4_ * auVar240._12_4_;
            auVar198._8_4_ = 0x39506967;
            auVar198._0_8_ = 0x3950696739506967;
            auVar198._12_4_ = 0x39506967;
            auVar280._8_4_ = 0x3ab743ce;
            auVar280._0_8_ = 0x3ab743ce3ab743ce;
            auVar280._12_4_ = 0x3ab743ce;
            auVar192 = vfmadd213ps_fma(auVar198,auVar240,auVar280);
            auVar217._8_4_ = 0x3c088908;
            auVar217._0_8_ = 0x3c0889083c088908;
            auVar217._12_4_ = 0x3c088908;
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar217);
            auVar218._8_4_ = 0x3d2aa9c1;
            auVar218._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar218._12_4_ = 0x3d2aa9c1;
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar218);
            auVar219._8_4_ = 0x3e2aaaaa;
            auVar219._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar219._12_4_ = 0x3e2aaaaa;
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar219);
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar53);
            auVar237 = ZEXT864(0) << 0x20;
            auVar192 = vfmadd213ps_fma(auVar192,auVar169,auVar240);
            auVar78._0_4_ = auVar192._0_4_ + fVar49;
            auVar78._4_4_ = auVar192._4_4_ + fVar70;
            auVar78._8_4_ = auVar192._8_4_ + fVar3;
            auVar78._12_4_ = auVar192._12_4_ + fVar4;
            auVar118._0_4_ = (int)auVar73._0_4_;
            auVar118._4_4_ = (int)auVar73._4_4_;
            auVar118._8_4_ = (int)auVar73._8_4_;
            auVar118._12_4_ = (int)auVar73._12_4_;
            auVar73 = vpslld_avx(auVar118,0x17);
            auVar73 = vpaddd_avx(auVar73,auVar110);
            auVar192 = vfmadd213ps_fma(auVar73,auVar78,auVar110);
            auVar73 = vrcpps_avx(auVar192);
            auVar110 = vfmsub213ps_fma(auVar192,auVar73,auVar110);
            auVar120 = vfnmadd132ps_fma(auVar110,auVar73,auVar73);
            break;
          case 5:
            auVar327._8_4_ = 0x42b0c0a5;
            auVar327._0_8_ = 0x42b0c0a542b0c0a5;
            auVar327._12_4_ = 0x42b0c0a5;
            auVar73 = vminps_avx(auVar327,auVar76);
            auVar335._8_4_ = 0xc2b0c0a5;
            auVar335._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar335._12_4_ = 0xc2b0c0a5;
            auVar240 = vmaxps_avx(auVar335,auVar73);
            auVar342._8_4_ = 0x3fb8aa3b;
            auVar342._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar342._12_4_ = 0x3fb8aa3b;
            auVar328._8_4_ = 0x3f000000;
            auVar328._0_8_ = 0x3f0000003f000000;
            auVar328._12_4_ = 0x3f000000;
            auVar73 = vfmadd213ps_fma(auVar342,auVar240,auVar328);
            auVar189._0_4_ = (int)auVar73._0_4_;
            auVar189._4_4_ = (int)auVar73._4_4_;
            auVar189._8_4_ = (int)auVar73._8_4_;
            auVar189._12_4_ = (int)auVar73._12_4_;
            auVar192 = vcvtdq2ps_avx(auVar189);
            auVar73 = vcmpps_avx(auVar73,auVar192,1);
            auVar73 = vandps_avx(auVar73,auVar110);
            auVar73 = vsubps_avx(auVar192,auVar73);
            auVar348._8_4_ = 0x3f318000;
            auVar348._0_8_ = 0x3f3180003f318000;
            auVar348._12_4_ = 0x3f318000;
            auVar192 = vfmsub231ps_fma(auVar240,auVar73,auVar348);
            auVar239._8_4_ = 0xb95e8083;
            auVar239._0_8_ = 0xb95e8083b95e8083;
            auVar239._12_4_ = 0xb95e8083;
            auVar240 = vfnmsub231ps_fma(auVar192,auVar73,auVar239);
            auVar190._0_4_ = auVar240._0_4_ * auVar240._0_4_;
            auVar190._4_4_ = auVar240._4_4_ * auVar240._4_4_;
            auVar190._8_4_ = auVar240._8_4_ * auVar240._8_4_;
            auVar190._12_4_ = auVar240._12_4_ * auVar240._12_4_;
            auVar359._8_4_ = 0x39506967;
            auVar359._0_8_ = 0x3950696739506967;
            auVar359._12_4_ = 0x39506967;
            auVar355._8_4_ = 0x3ab743ce;
            auVar355._0_8_ = 0x3ab743ce3ab743ce;
            auVar355._12_4_ = 0x3ab743ce;
            auVar192 = vfmadd213ps_fma(auVar359,auVar240,auVar355);
            auVar215._8_4_ = 0x3c088908;
            auVar215._0_8_ = 0x3c0889083c088908;
            auVar215._12_4_ = 0x3c088908;
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar215);
            auVar285._8_4_ = 0x3d2aa9c1;
            auVar285._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar285._12_4_ = 0x3d2aa9c1;
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar285);
            auVar286._8_4_ = 0x3e2aaaaa;
            auVar286._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar286._12_4_ = 0x3e2aaaaa;
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar286);
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar328);
            auVar192 = vfmadd213ps_fma(auVar192,auVar190,auVar240);
            auVar191._0_4_ = auVar192._0_4_ + fVar49;
            auVar191._4_4_ = auVar192._4_4_ + fVar70;
            auVar191._8_4_ = auVar192._8_4_ + fVar3;
            auVar191._12_4_ = auVar192._12_4_ + fVar4;
            auVar112._0_4_ = (int)auVar73._0_4_;
            auVar112._4_4_ = (int)auVar73._4_4_;
            auVar112._8_4_ = (int)auVar73._8_4_;
            auVar112._12_4_ = (int)auVar73._12_4_;
            auVar73 = vpslld_avx(auVar112,0x17);
            auVar73 = vpaddd_avx(auVar73,auVar110);
            auVar54 = vfmadd213ps_fma(auVar73,auVar191,auVar110);
            auVar161._8_4_ = 0x800000;
            auVar161._0_8_ = 0x80000000800000;
            auVar161._12_4_ = 0x800000;
            auVar73 = vmaxps_avx(auVar54,auVar161);
            auVar192 = vpsrld_avx(auVar73,0x17);
            auVar276._8_4_ = 0xffffff82;
            auVar276._0_8_ = 0xffffff82ffffff82;
            auVar276._12_4_ = 0xffffff82;
            auVar192 = vpaddd_avx(auVar192,auVar276);
            auVar277._8_4_ = 0x807fffff;
            auVar277._0_8_ = 0x807fffff807fffff;
            auVar277._12_4_ = 0x807fffff;
            auVar73 = vandps_avx(auVar73,auVar277);
            auVar75 = vorps_avx(auVar328,auVar73);
            auVar240 = vcvtdq2ps_avx(auVar192);
            auVar278._8_4_ = 0x3f3504f3;
            auVar278._0_8_ = 0x3f3504f33f3504f3;
            auVar278._12_4_ = 0x3f3504f3;
            auVar192 = vcmpps_avx(auVar75,auVar278,1);
            auVar73 = vandps_avx(auVar192,auVar75);
            auVar162._0_4_ = auVar73._0_4_ + auVar75._0_4_ + -1.0;
            auVar162._4_4_ = auVar73._4_4_ + auVar75._4_4_ + -1.0;
            auVar162._8_4_ = auVar73._8_4_ + auVar75._8_4_ + -1.0;
            auVar162._12_4_ = auVar73._12_4_ + auVar75._12_4_ + -1.0;
            auVar73 = vandps_avx(auVar192,auVar110);
            auVar192 = vsubps_avx(auVar240,auVar73);
            auVar279._0_4_ = auVar162._0_4_ * auVar162._0_4_;
            auVar279._4_4_ = auVar162._4_4_ * auVar162._4_4_;
            auVar279._8_4_ = auVar162._8_4_ * auVar162._8_4_;
            auVar279._12_4_ = auVar162._12_4_ * auVar162._12_4_;
            auVar287._8_4_ = 0x3d9021bb;
            auVar287._0_8_ = 0x3d9021bb3d9021bb;
            auVar287._12_4_ = 0x3d9021bb;
            auVar298._8_4_ = 0xbdebd1b8;
            auVar298._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar298._12_4_ = 0xbdebd1b8;
            auVar73 = vfmadd213ps_fma(auVar287,auVar162,auVar298);
            auVar299._8_4_ = 0x3def251a;
            auVar299._0_8_ = 0x3def251a3def251a;
            auVar299._12_4_ = 0x3def251a;
            auVar73 = vfmadd213ps_fma(auVar73,auVar162,auVar299);
            auVar300._8_4_ = 0xbdfe5d4f;
            auVar300._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar300._12_4_ = 0xbdfe5d4f;
            auVar73 = vfmadd213ps_fma(auVar73,auVar162,auVar300);
            auVar301._8_4_ = 0x3e11e9bf;
            auVar301._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar301._12_4_ = 0x3e11e9bf;
            auVar73 = vfmadd213ps_fma(auVar73,auVar162,auVar301);
            auVar302._8_4_ = 0xbe2aae50;
            auVar302._0_8_ = 0xbe2aae50be2aae50;
            auVar302._12_4_ = 0xbe2aae50;
            auVar73 = vfmadd213ps_fma(auVar73,auVar162,auVar302);
            auVar303._8_4_ = 0x3e4cceac;
            auVar303._0_8_ = 0x3e4cceac3e4cceac;
            auVar303._12_4_ = 0x3e4cceac;
            auVar73 = vfmadd213ps_fma(auVar73,auVar162,auVar303);
            auVar304._8_4_ = 0xbe7ffffc;
            auVar304._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar304._12_4_ = 0xbe7ffffc;
            auVar73 = vfmadd213ps_fma(auVar73,auVar162,auVar304);
            auVar305._8_4_ = 0x3eaaaaaa;
            auVar305._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar305._12_4_ = 0x3eaaaaaa;
            auVar73 = vfmadd213ps_fma(auVar73,auVar162,auVar305);
            auVar288._0_4_ = auVar279._0_4_ * auVar162._0_4_ * auVar73._0_4_;
            auVar288._4_4_ = auVar279._4_4_ * auVar162._4_4_ * auVar73._4_4_;
            auVar288._8_4_ = auVar279._8_4_ * auVar162._8_4_ * auVar73._8_4_;
            auVar288._12_4_ = auVar279._12_4_ * auVar162._12_4_ * auVar73._12_4_;
            auVar73 = vfmadd231ps_fma(auVar288,auVar192,auVar239);
            auVar240 = vfmsub231ps_fma(auVar73,auVar328,auVar279);
            auVar73 = vcmpps_avx(auVar54,_DAT_004d6070,2);
            auVar240 = vsubps_avx(auVar240,auVar162);
            auVar192 = vfnmadd231ps_fma(auVar240,auVar348,auVar192);
            auVar163._0_4_ = auVar192._0_4_ + auVar192._0_4_;
            auVar163._4_4_ = auVar192._4_4_ + auVar192._4_4_;
            auVar163._8_4_ = auVar192._8_4_ + auVar192._8_4_;
            auVar163._12_4_ = auVar192._12_4_ + auVar192._12_4_;
            auVar193._8_4_ = 0x7fffffff;
            auVar193._0_8_ = 0x7fffffff7fffffff;
            auVar193._12_4_ = 0x7fffffff;
            auVar73 = vblendvps_avx(auVar163,auVar193,auVar73);
            auVar164._8_4_ = 0x42b0c0a5;
            auVar164._0_8_ = 0x42b0c0a542b0c0a5;
            auVar164._12_4_ = 0x42b0c0a5;
            auVar73 = vminps_avx(auVar73,auVar164);
            auVar240 = vmaxps_avx(auVar335,auVar73);
            auVar73 = vfmadd213ps_fma(auVar342,auVar240,auVar328);
            auVar194._0_4_ = (int)auVar73._0_4_;
            auVar194._4_4_ = (int)auVar73._4_4_;
            auVar194._8_4_ = (int)auVar73._8_4_;
            auVar194._12_4_ = (int)auVar73._12_4_;
            auVar192 = vcvtdq2ps_avx(auVar194);
            auVar73 = vcmpps_avx(auVar73,auVar192,1);
            auVar73 = vandps_avx(auVar73,auVar110);
            auVar73 = vsubps_avx(auVar192,auVar73);
            auVar192 = vfmsub231ps_fma(auVar240,auVar73,auVar348);
            auVar240 = vfnmsub231ps_fma(auVar192,auVar73,auVar239);
            auVar363 = ZEXT1664(auVar110);
            auVar195._0_4_ = auVar240._0_4_ * auVar240._0_4_;
            auVar195._4_4_ = auVar240._4_4_ * auVar240._4_4_;
            auVar195._8_4_ = auVar240._8_4_ * auVar240._8_4_;
            auVar195._12_4_ = auVar240._12_4_ * auVar240._12_4_;
            auVar192 = vfmadd213ps_fma(auVar359,auVar240,auVar355);
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar215);
            auVar51._8_4_ = 0x3d2aa9c1;
            auVar51._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar51._12_4_ = 0x3d2aa9c1;
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar51);
            auVar52._8_4_ = 0x3e2aaaaa;
            auVar52._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar52._12_4_ = 0x3e2aaaaa;
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar52);
            auVar192 = vfmadd213ps_fma(auVar192,auVar240,auVar328);
            auVar237 = ZEXT864(0);
            auVar192 = vfmadd213ps_fma(auVar192,auVar195,auVar240);
            auVar196._0_4_ = auVar192._0_4_ + fVar49;
            auVar196._4_4_ = auVar192._4_4_ + fVar70;
            auVar196._8_4_ = auVar192._8_4_ + fVar3;
            auVar196._12_4_ = auVar192._12_4_ + fVar4;
            auVar113._0_4_ = (int)auVar73._0_4_;
            auVar113._4_4_ = (int)auVar73._4_4_;
            auVar113._8_4_ = (int)auVar73._8_4_;
            auVar113._12_4_ = (int)auVar73._12_4_;
            auVar73 = vpslld_avx(auVar113,0x17);
            auVar73 = vpaddd_avx(auVar73,auVar110);
            auVar110 = vfmadd213ps_fma(auVar73,auVar196,auVar110);
            auVar73 = vrcpps_avx(auVar110);
            auVar197._0_4_ = auVar73._0_4_ + auVar73._0_4_;
            auVar197._4_4_ = auVar73._4_4_ + auVar73._4_4_;
            auVar197._8_4_ = auVar73._8_4_ + auVar73._8_4_;
            auVar197._12_4_ = auVar73._12_4_ + auVar73._12_4_;
            auVar216._8_4_ = 0x40000000;
            auVar216._0_8_ = 0x4000000040000000;
            auVar216._12_4_ = 0x40000000;
            auVar110 = vfmsub213ps_fma(auVar110,auVar197,auVar216);
            auVar73 = vfnmadd213ps_fma(auVar110,auVar73,auVar197);
            auVar120 = vfmsub213ps_fma(auVar73,auVar76,auVar76);
            break;
          case 6:
            uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
            auVar119._4_4_ = uVar2;
            auVar119._0_4_ = uVar2;
            auVar119._8_4_ = uVar2;
            auVar119._12_4_ = uVar2;
            uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
            auVar170._4_4_ = uVar2;
            auVar170._0_4_ = uVar2;
            auVar170._8_4_ = uVar2;
            auVar170._12_4_ = uVar2;
            auVar192 = vfmadd231ps_fma(auVar170,auVar76,auVar119);
            auVar73 = vmaxps_avx(auVar192,auVar73);
            auVar73 = vminps_avx(auVar73,auVar110);
            auVar120._0_4_ = auVar73._0_4_ * auVar76._0_4_;
            auVar120._4_4_ = auVar73._4_4_ * auVar76._4_4_;
            auVar120._8_4_ = auVar73._8_4_ * auVar76._8_4_;
            auVar120._12_4_ = auVar73._12_4_ * auVar76._12_4_;
          }
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar38 * 0x10) = auVar120;
      }
    }
    else if (_elempack == 8) {
      p_Var9 = this->_vptr_InnerProduct_x86_fma[-3];
      iVar27 = *(int *)(&this->field_0xe0 + (long)p_Var9);
      iVar30 = local_370 * local_35c;
      lVar11 = *(long *)(&this->field_0x178 + (long)p_Var9);
      uVar33 = (ulong)(uint)top_blob->w;
      if (top_blob->w < 1) {
        uVar33 = 0;
      }
      auVar237 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar363 = ZEXT1664(ZEXT816(0) << 0x40);
      for (uVar38 = 0; uVar38 != uVar33; uVar38 = uVar38 + 1) {
        auVar73 = ZEXT816(0) << 0x40;
        auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar11 != 0) {
          auVar69 = ZEXT3264(*(undefined1 (*) [32])(lVar11 + uVar38 * 0x20));
        }
        pauVar41 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar38 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        lVar44 = 0;
        iVar46 = 0;
        auVar71 = ZEXT816(0) << 0x40;
        auVar54 = ZEXT816(0) << 0x40;
        auVar75 = ZEXT816(0) << 0x40;
        auVar240 = ZEXT816(0) << 0x40;
        auVar192 = ZEXT816(0) << 0x40;
        auVar110 = ZEXT816(0) << 0x40;
        pauVar31 = local_388;
        while( true ) {
          if (iVar30 <= iVar46 + 7) break;
          auVar64 = vlddqu_avx(*pauVar41);
          uVar2 = *(undefined4 *)*pauVar31;
          auVar350._4_4_ = uVar2;
          auVar350._0_4_ = uVar2;
          auVar350._8_4_ = uVar2;
          auVar350._12_4_ = uVar2;
          auVar350._16_4_ = uVar2;
          auVar350._20_4_ = uVar2;
          auVar350._24_4_ = uVar2;
          auVar350._28_4_ = uVar2;
          auVar66 = vcvtph2ps_f16c(auVar64._0_16_);
          auVar329 = vfmadd231ps_fma(auVar69._0_32_,auVar350,auVar66);
          auVar69 = ZEXT1664(auVar329);
          uVar2 = *(undefined4 *)(*pauVar31 + 4);
          auVar307._4_4_ = uVar2;
          auVar307._0_4_ = uVar2;
          auVar307._8_4_ = uVar2;
          auVar307._12_4_ = uVar2;
          auVar307._16_4_ = uVar2;
          auVar307._20_4_ = uVar2;
          auVar307._24_4_ = uVar2;
          auVar307._28_4_ = uVar2;
          auVar66 = vcvtph2ps_f16c(auVar64._16_16_);
          auVar64 = vlddqu_avx(pauVar41[1]);
          uVar2 = *(undefined4 *)(*pauVar31 + 8);
          auVar253._4_4_ = uVar2;
          auVar253._0_4_ = uVar2;
          auVar253._8_4_ = uVar2;
          auVar253._12_4_ = uVar2;
          auVar253._16_4_ = uVar2;
          auVar253._20_4_ = uVar2;
          auVar253._24_4_ = uVar2;
          auVar253._28_4_ = uVar2;
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar307,auVar66);
          auVar66 = vcvtph2ps_f16c(auVar64._0_16_);
          uVar2 = *(undefined4 *)(*pauVar31 + 0xc);
          auVar344._4_4_ = uVar2;
          auVar344._0_4_ = uVar2;
          auVar344._8_4_ = uVar2;
          auVar344._12_4_ = uVar2;
          auVar344._16_4_ = uVar2;
          auVar344._20_4_ = uVar2;
          auVar344._24_4_ = uVar2;
          auVar344._28_4_ = uVar2;
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar253,auVar66);
          auVar64 = vcvtph2ps_f16c(auVar64._16_16_);
          auVar240 = vfmadd231ps_fma(ZEXT1632(auVar240),auVar344,auVar64);
          auVar64 = vlddqu_avx(pauVar41[2]);
          uVar2 = *(undefined4 *)(*pauVar31 + 0x10);
          auVar308._4_4_ = uVar2;
          auVar308._0_4_ = uVar2;
          auVar308._8_4_ = uVar2;
          auVar308._12_4_ = uVar2;
          auVar308._16_4_ = uVar2;
          auVar308._20_4_ = uVar2;
          auVar308._24_4_ = uVar2;
          auVar308._28_4_ = uVar2;
          auVar66 = vcvtph2ps_f16c(auVar64._0_16_);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar308,auVar66);
          uVar2 = *(undefined4 *)(*pauVar31 + 0x14);
          auVar309._4_4_ = uVar2;
          auVar309._0_4_ = uVar2;
          auVar309._8_4_ = uVar2;
          auVar309._12_4_ = uVar2;
          auVar309._16_4_ = uVar2;
          auVar309._20_4_ = uVar2;
          auVar309._24_4_ = uVar2;
          auVar309._28_4_ = uVar2;
          auVar66 = vcvtph2ps_f16c(auVar64._16_16_);
          auVar64 = vlddqu_avx(pauVar41[3]);
          uVar2 = *(undefined4 *)(*pauVar31 + 0x18);
          auVar351._4_4_ = uVar2;
          auVar351._0_4_ = uVar2;
          auVar351._8_4_ = uVar2;
          auVar351._12_4_ = uVar2;
          auVar351._16_4_ = uVar2;
          auVar351._20_4_ = uVar2;
          auVar351._24_4_ = uVar2;
          auVar351._28_4_ = uVar2;
          auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar309,auVar66);
          auVar66 = vcvtph2ps_f16c(auVar64._0_16_);
          uVar2 = *(undefined4 *)(*pauVar31 + 0x1c);
          auVar310._4_4_ = uVar2;
          auVar310._0_4_ = uVar2;
          auVar310._8_4_ = uVar2;
          auVar310._12_4_ = uVar2;
          auVar310._16_4_ = uVar2;
          auVar310._20_4_ = uVar2;
          auVar310._24_4_ = uVar2;
          auVar310._28_4_ = uVar2;
          auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar351,auVar66);
          auVar64 = vcvtph2ps_f16c(auVar64._16_16_);
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar310,auVar64);
          pauVar31 = pauVar31 + 1;
          pauVar41 = pauVar41 + 4;
          iVar46 = iVar46 + 8;
          lVar44 = lVar44 + 8;
        }
        for (; iVar46 + 3 < iVar30; iVar46 = iVar46 + 4) {
          auVar64 = vlddqu_avx(*pauVar41);
          uVar2 = *(undefined4 *)*pauVar31;
          auVar311._4_4_ = uVar2;
          auVar311._0_4_ = uVar2;
          auVar311._8_4_ = uVar2;
          auVar311._12_4_ = uVar2;
          auVar311._16_4_ = uVar2;
          auVar311._20_4_ = uVar2;
          auVar311._24_4_ = uVar2;
          auVar311._28_4_ = uVar2;
          auVar66 = vcvtph2ps_f16c(auVar64._0_16_);
          auVar329 = vfmadd231ps_fma(auVar69._0_32_,auVar311,auVar66);
          auVar69 = ZEXT1664(auVar329);
          uVar2 = *(undefined4 *)(*pauVar31 + 4);
          auVar312._4_4_ = uVar2;
          auVar312._0_4_ = uVar2;
          auVar312._8_4_ = uVar2;
          auVar312._12_4_ = uVar2;
          auVar312._16_4_ = uVar2;
          auVar312._20_4_ = uVar2;
          auVar312._24_4_ = uVar2;
          auVar312._28_4_ = uVar2;
          auVar66 = vcvtph2ps_f16c(auVar64._16_16_);
          auVar64 = vlddqu_avx(pauVar41[1]);
          uVar2 = *(undefined4 *)(*pauVar31 + 8);
          auVar352._4_4_ = uVar2;
          auVar352._0_4_ = uVar2;
          auVar352._8_4_ = uVar2;
          auVar352._12_4_ = uVar2;
          auVar352._16_4_ = uVar2;
          auVar352._20_4_ = uVar2;
          auVar352._24_4_ = uVar2;
          auVar352._28_4_ = uVar2;
          auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar312,auVar66);
          auVar66 = vcvtph2ps_f16c(auVar64._0_16_);
          uVar2 = *(undefined4 *)(*pauVar31 + 0xc);
          auVar313._4_4_ = uVar2;
          auVar313._0_4_ = uVar2;
          auVar313._8_4_ = uVar2;
          auVar313._12_4_ = uVar2;
          auVar313._16_4_ = uVar2;
          auVar313._20_4_ = uVar2;
          auVar313._24_4_ = uVar2;
          auVar313._28_4_ = uVar2;
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar352,auVar66);
          auVar64 = vcvtph2ps_f16c(auVar64._16_16_);
          auVar240 = vfmadd231ps_fma(ZEXT1632(auVar240),auVar313,auVar64);
          pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
          pauVar41 = pauVar41 + 2;
          lVar44 = lVar44 + 4;
        }
        for (; (int)lVar44 < iVar30; lVar44 = lVar44 + 1) {
          uVar2 = *(undefined4 *)(*local_388 + lVar44 * 4);
          auVar254._4_4_ = uVar2;
          auVar254._0_4_ = uVar2;
          auVar254._8_4_ = uVar2;
          auVar254._12_4_ = uVar2;
          auVar254._16_4_ = uVar2;
          auVar254._20_4_ = uVar2;
          auVar254._24_4_ = uVar2;
          auVar254._28_4_ = uVar2;
          auVar329 = vlddqu_avx(*(undefined1 (*) [16])*pauVar41);
          auVar64 = vcvtph2ps_f16c(auVar329);
          auVar329 = vfmadd231ps_fma(auVar69._0_32_,auVar254,auVar64);
          auVar69 = ZEXT1664(auVar329);
          pauVar41 = (undefined1 (*) [32])(*pauVar41 + 0x10);
        }
        fVar49 = auVar73._0_4_ + auVar71._0_4_ + auVar54._0_4_ + auVar75._0_4_ +
                 auVar110._0_4_ + auVar240._0_4_ + auVar192._0_4_ + auVar69._0_4_;
        fVar70 = auVar73._4_4_ + auVar71._4_4_ + auVar54._4_4_ + auVar75._4_4_ +
                 auVar110._4_4_ + auVar240._4_4_ + auVar192._4_4_ + auVar69._4_4_;
        auVar59._0_8_ = CONCAT44(fVar70,fVar49);
        auVar59._8_4_ =
             auVar73._8_4_ + auVar71._8_4_ + auVar54._8_4_ + auVar75._8_4_ +
             auVar110._8_4_ + auVar240._8_4_ + auVar192._8_4_ + auVar69._8_4_;
        auVar59._12_4_ =
             auVar73._12_4_ + auVar71._12_4_ + auVar54._12_4_ + auVar75._12_4_ +
             auVar110._12_4_ + auVar240._12_4_ + auVar192._12_4_ + auVar69._12_4_;
        auVar59._16_4_ = auVar69._16_4_ + 0.0;
        auVar59._20_4_ = auVar69._20_4_ + 0.0;
        auVar59._24_4_ = auVar69._24_4_ + 0.0;
        auVar59._28_4_ = auVar69._28_4_ + 0.0;
        auVar64 = auVar59;
        if (5 < iVar27 - 1U) goto switchD_002f4fb9_caseD_1;
        auVar61 = auVar363._0_32_;
        auVar64 = vmaxps_avx(auVar61,auVar59);
        auVar66 = auVar237._0_32_;
        fVar3 = auVar237._0_4_;
        fVar4 = auVar237._4_4_;
        fVar159 = auVar237._8_4_;
        fVar14 = auVar237._12_4_;
        fVar15 = auVar237._16_4_;
        fVar16 = auVar237._20_4_;
        fVar17 = auVar237._24_4_;
        fVar18 = auVar237._28_4_;
        switch(iVar27) {
        case 2:
          auVar66 = vminps_avx(auVar61,auVar59);
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar135._4_4_ = uVar2;
          auVar135._0_4_ = uVar2;
          auVar135._8_4_ = uVar2;
          auVar135._12_4_ = uVar2;
          auVar135._16_4_ = uVar2;
          auVar135._20_4_ = uVar2;
          auVar135._24_4_ = uVar2;
          auVar135._28_4_ = uVar2;
          auVar73 = vfmadd231ps_fma(auVar64,auVar66,auVar135);
          auVar64 = ZEXT1632(auVar73);
          break;
        case 3:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar94._4_4_ = uVar2;
          auVar94._0_4_ = uVar2;
          auVar94._8_4_ = uVar2;
          auVar94._12_4_ = uVar2;
          auVar94._16_4_ = uVar2;
          auVar94._20_4_ = uVar2;
          auVar94._24_4_ = uVar2;
          auVar94._28_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar144._4_4_ = uVar2;
          auVar144._0_4_ = uVar2;
          auVar144._8_4_ = uVar2;
          auVar144._12_4_ = uVar2;
          auVar144._16_4_ = uVar2;
          auVar144._20_4_ = uVar2;
          auVar144._24_4_ = uVar2;
          auVar144._28_4_ = uVar2;
          auVar64 = vmaxps_avx(auVar59,auVar94);
          auVar64 = vminps_avx(auVar64,auVar144);
          break;
        case 4:
          auVar60._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
          auVar60._8_4_ = -auVar59._8_4_;
          auVar60._12_4_ = -auVar59._12_4_;
          auVar60._16_4_ = -auVar59._16_4_;
          auVar60._20_4_ = -auVar59._20_4_;
          auVar60._24_4_ = -auVar59._24_4_;
          auVar60._28_4_ = -auVar59._28_4_;
          auVar95._8_4_ = 0x42b0c0a5;
          auVar95._0_8_ = 0x42b0c0a542b0c0a5;
          auVar95._12_4_ = 0x42b0c0a5;
          auVar95._16_4_ = 0x42b0c0a5;
          auVar95._20_4_ = 0x42b0c0a5;
          auVar95._24_4_ = 0x42b0c0a5;
          auVar95._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar60,auVar95);
          auVar96._8_4_ = 0xc2b0c0a5;
          auVar96._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar96._12_4_ = 0xc2b0c0a5;
          auVar96._16_4_ = 0xc2b0c0a5;
          auVar96._20_4_ = 0xc2b0c0a5;
          auVar96._24_4_ = 0xc2b0c0a5;
          auVar96._28_4_ = 0xc2b0c0a5;
          auVar61 = vmaxps_avx(auVar64,auVar96);
          auVar97._8_4_ = 0x3fb8aa3b;
          auVar97._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar97._12_4_ = 0x3fb8aa3b;
          auVar97._16_4_ = 0x3fb8aa3b;
          auVar97._20_4_ = 0x3fb8aa3b;
          auVar97._24_4_ = 0x3fb8aa3b;
          auVar97._28_4_ = 0x3fb8aa3b;
          auVar282._8_4_ = 0x3f000000;
          auVar282._0_8_ = 0x3f0000003f000000;
          auVar282._12_4_ = 0x3f000000;
          auVar282._16_4_ = 0x3f000000;
          auVar282._20_4_ = 0x3f000000;
          auVar282._24_4_ = 0x3f000000;
          auVar282._28_4_ = 0x3f000000;
          auVar73 = vfmadd213ps_fma(auVar97,auVar61,auVar282);
          auVar109 = vroundps_avx(ZEXT1632(auVar73),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar73),auVar109,1);
          auVar64 = vandps_avx(auVar64,auVar66);
          auVar64 = vsubps_avx(auVar109,auVar64);
          auVar145._8_4_ = 0x3f318000;
          auVar145._0_8_ = 0x3f3180003f318000;
          auVar145._12_4_ = 0x3f318000;
          auVar145._16_4_ = 0x3f318000;
          auVar145._20_4_ = 0x3f318000;
          auVar145._24_4_ = 0x3f318000;
          auVar145._28_4_ = 0x3f318000;
          auVar73 = vfmsub231ps_fma(auVar61,auVar64,auVar145);
          auVar146._8_4_ = 0x395e8083;
          auVar146._0_8_ = 0x395e8083395e8083;
          auVar146._12_4_ = 0x395e8083;
          auVar146._16_4_ = 0x395e8083;
          auVar146._20_4_ = 0x395e8083;
          auVar146._24_4_ = 0x395e8083;
          auVar146._28_4_ = 0x395e8083;
          auVar110 = vfmsub231ps_fma(ZEXT1632(auVar73),auVar64,auVar146);
          auVar61 = ZEXT1632(auVar110);
          auVar21._28_4_ = 0x395e8083;
          auVar21._0_28_ =
               ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                  CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                           CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                    auVar110._0_4_ * auVar110._0_4_))));
          auVar208._8_4_ = 0x39506967;
          auVar208._0_8_ = 0x3950696739506967;
          auVar208._12_4_ = 0x39506967;
          auVar208._16_4_ = 0x39506967;
          auVar208._20_4_ = 0x39506967;
          auVar208._24_4_ = 0x39506967;
          auVar208._28_4_ = 0x39506967;
          auVar258._8_4_ = 0x3ab743ce;
          auVar258._0_8_ = 0x3ab743ce3ab743ce;
          auVar258._12_4_ = 0x3ab743ce;
          auVar258._16_4_ = 0x3ab743ce;
          auVar258._20_4_ = 0x3ab743ce;
          auVar258._24_4_ = 0x3ab743ce;
          auVar258._28_4_ = 0x3ab743ce;
          auVar73 = vfmadd213ps_fma(auVar208,auVar61,auVar258);
          auVar181._8_4_ = 0x3c088908;
          auVar181._0_8_ = 0x3c0889083c088908;
          auVar181._12_4_ = 0x3c088908;
          auVar181._16_4_ = 0x3c088908;
          auVar181._20_4_ = 0x3c088908;
          auVar181._24_4_ = 0x3c088908;
          auVar181._28_4_ = 0x3c088908;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar181);
          auVar182._8_4_ = 0x3d2aa9c1;
          auVar182._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar182._12_4_ = 0x3d2aa9c1;
          auVar182._16_4_ = 0x3d2aa9c1;
          auVar182._20_4_ = 0x3d2aa9c1;
          auVar182._24_4_ = 0x3d2aa9c1;
          auVar182._28_4_ = 0x3d2aa9c1;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar182);
          auVar183._8_4_ = 0x3e2aaaaa;
          auVar183._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar183._12_4_ = 0x3e2aaaaa;
          auVar183._16_4_ = 0x3e2aaaaa;
          auVar183._20_4_ = 0x3e2aaaaa;
          auVar183._24_4_ = 0x3e2aaaaa;
          auVar183._28_4_ = 0x3e2aaaaa;
          auVar61 = ZEXT1632(auVar110);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar183);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar282);
          auVar192 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar21,auVar61);
          auVar50._0_4_ = (int)auVar64._0_4_;
          auVar50._4_4_ = (int)auVar64._4_4_;
          auVar50._8_4_ = (int)auVar64._8_4_;
          auVar50._12_4_ = (int)auVar64._12_4_;
          auVar62._16_4_ = (int)auVar64._16_4_;
          auVar62._0_16_ = auVar50;
          auVar62._20_4_ = (int)auVar64._20_4_;
          auVar62._24_4_ = (int)auVar64._24_4_;
          auVar62._28_4_ = (int)auVar64._28_4_;
          auVar110 = vpslld_avx(auVar50,0x17);
          auVar73 = vpslld_avx(auVar62._16_16_,0x17);
          auVar111._8_4_ = 0x3f800000;
          auVar111._0_8_ = 0x3f8000003f800000;
          auVar111._12_4_ = 0x3f800000;
          auVar73 = vpaddd_avx(auVar73,auVar111);
          auVar110 = vpaddd_avx(auVar110,auVar111);
          auVar98._16_16_ = auVar73;
          auVar98._0_16_ = auVar110;
          auVar63._0_4_ = auVar192._0_4_ + fVar3;
          auVar63._4_4_ = auVar192._4_4_ + fVar4;
          auVar63._8_4_ = auVar192._8_4_ + fVar159;
          auVar63._12_4_ = auVar192._12_4_ + fVar14;
          auVar63._16_4_ = fVar15 + 0.0;
          auVar63._20_4_ = fVar16 + 0.0;
          auVar63._24_4_ = fVar17 + 0.0;
          auVar63._28_4_ = fVar18 + 0.0;
          auVar73 = vfmadd213ps_fma(auVar98,auVar63,auVar66);
          auVar64 = vrcpps_avx(ZEXT1632(auVar73));
          auVar73 = vfmsub213ps_fma(ZEXT1632(auVar73),auVar64,auVar66);
          auVar73 = vfnmadd132ps_fma(ZEXT1632(auVar73),auVar64,auVar64);
          auVar64 = ZEXT1632(auVar73);
          break;
        case 5:
          auVar331._8_4_ = 0x42b0c0a5;
          auVar331._0_8_ = 0x42b0c0a542b0c0a5;
          auVar331._12_4_ = 0x42b0c0a5;
          auVar331._16_4_ = 0x42b0c0a5;
          auVar331._20_4_ = 0x42b0c0a5;
          auVar331._24_4_ = 0x42b0c0a5;
          auVar331._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar331,auVar59);
          auVar337._8_4_ = 0xc2b0c0a5;
          auVar337._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar337._12_4_ = 0xc2b0c0a5;
          auVar337._16_4_ = 0xc2b0c0a5;
          auVar337._20_4_ = 0xc2b0c0a5;
          auVar337._24_4_ = 0xc2b0c0a5;
          auVar337._28_4_ = 0xc2b0c0a5;
          auVar61 = vmaxps_avx(auVar337,auVar64);
          auVar136._8_4_ = 0x3fb8aa3b;
          auVar136._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar136._12_4_ = 0x3fb8aa3b;
          auVar136._16_4_ = 0x3fb8aa3b;
          auVar136._20_4_ = 0x3fb8aa3b;
          auVar136._24_4_ = 0x3fb8aa3b;
          auVar136._28_4_ = 0x3fb8aa3b;
          auVar361._8_4_ = 0x3f000000;
          auVar361._0_8_ = 0x3f0000003f000000;
          auVar361._12_4_ = 0x3f000000;
          auVar361._16_4_ = 0x3f000000;
          auVar361._20_4_ = 0x3f000000;
          auVar361._24_4_ = 0x3f000000;
          auVar361._28_4_ = 0x3f000000;
          auVar73 = vfmadd213ps_fma(auVar136,auVar61,auVar361);
          auVar109 = vroundps_avx(ZEXT1632(auVar73),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar73),auVar109,1);
          auVar64 = vandps_avx(auVar64,auVar66);
          auVar64 = vsubps_avx(auVar109,auVar64);
          auVar353._8_4_ = 0x3f318000;
          auVar353._0_8_ = 0x3f3180003f318000;
          auVar353._12_4_ = 0x3f318000;
          auVar353._16_4_ = 0x3f318000;
          auVar353._20_4_ = 0x3f318000;
          auVar353._24_4_ = 0x3f318000;
          auVar353._28_4_ = 0x3f318000;
          auVar73 = vfmsub231ps_fma(auVar61,auVar64,auVar353);
          auVar338._8_4_ = 0xb95e8083;
          auVar338._0_8_ = 0xb95e8083b95e8083;
          auVar338._12_4_ = 0xb95e8083;
          auVar338._16_4_ = 0xb95e8083;
          auVar338._20_4_ = 0xb95e8083;
          auVar338._24_4_ = 0xb95e8083;
          auVar338._28_4_ = 0xb95e8083;
          auVar110 = vfnmsub231ps_fma(ZEXT1632(auVar73),auVar64,auVar338);
          auVar61 = ZEXT1632(auVar110);
          auVar19._28_4_ = auVar109._28_4_;
          auVar19._0_28_ =
               ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                  CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                           CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                    auVar110._0_4_ * auVar110._0_4_))));
          auVar255._8_4_ = 0x39506967;
          auVar255._0_8_ = 0x3950696739506967;
          auVar255._12_4_ = 0x39506967;
          auVar255._16_4_ = 0x39506967;
          auVar255._20_4_ = 0x39506967;
          auVar255._24_4_ = 0x39506967;
          auVar255._28_4_ = 0x39506967;
          auVar357._8_4_ = 0x3ab743ce;
          auVar357._0_8_ = 0x3ab743ce3ab743ce;
          auVar357._12_4_ = 0x3ab743ce;
          auVar357._16_4_ = 0x3ab743ce;
          auVar357._20_4_ = 0x3ab743ce;
          auVar357._24_4_ = 0x3ab743ce;
          auVar357._28_4_ = 0x3ab743ce;
          auVar73 = vfmadd213ps_fma(auVar255,auVar61,auVar357);
          auVar180._8_4_ = 0x3c088908;
          auVar180._0_8_ = 0x3c0889083c088908;
          auVar180._12_4_ = 0x3c088908;
          auVar180._16_4_ = 0x3c088908;
          auVar180._20_4_ = 0x3c088908;
          auVar180._24_4_ = 0x3c088908;
          auVar180._28_4_ = 0x3c088908;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar180);
          auVar227._8_4_ = 0x3d2aa9c1;
          auVar227._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar227._12_4_ = 0x3d2aa9c1;
          auVar227._16_4_ = 0x3d2aa9c1;
          auVar227._20_4_ = 0x3d2aa9c1;
          auVar227._24_4_ = 0x3d2aa9c1;
          auVar227._28_4_ = 0x3d2aa9c1;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar227);
          auVar345._8_4_ = 0x3e2aaaaa;
          auVar345._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar345._12_4_ = 0x3e2aaaaa;
          auVar345._16_4_ = 0x3e2aaaaa;
          auVar345._20_4_ = 0x3e2aaaaa;
          auVar345._24_4_ = 0x3e2aaaaa;
          auVar345._28_4_ = 0x3e2aaaaa;
          auVar61 = ZEXT1632(auVar110);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar345);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar361);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar19,auVar61);
          auVar205._0_4_ = auVar73._0_4_ + fVar3;
          auVar205._4_4_ = auVar73._4_4_ + fVar4;
          auVar205._8_4_ = auVar73._8_4_ + fVar159;
          auVar205._12_4_ = auVar73._12_4_ + fVar14;
          auVar205._16_4_ = fVar15 + 0.0;
          auVar205._20_4_ = fVar16 + 0.0;
          auVar205._24_4_ = fVar17 + 0.0;
          auVar205._28_4_ = fVar18 + 0.0;
          auVar72._0_4_ = (int)auVar64._0_4_;
          auVar72._4_4_ = (int)auVar64._4_4_;
          auVar72._8_4_ = (int)auVar64._8_4_;
          auVar72._12_4_ = (int)auVar64._12_4_;
          auVar90._16_4_ = (int)auVar64._16_4_;
          auVar90._0_16_ = auVar72;
          auVar90._20_4_ = (int)auVar64._20_4_;
          auVar90._24_4_ = (int)auVar64._24_4_;
          auVar90._28_4_ = (int)auVar64._28_4_;
          auVar110 = vpslld_avx(auVar72,0x17);
          auVar73 = vpslld_avx(auVar90._16_16_,0x17);
          auVar275._8_4_ = 0x3f800000;
          auVar275._0_8_ = 0x3f8000003f800000;
          auVar275._12_4_ = 0x3f800000;
          auVar73 = vpaddd_avx(auVar73,auVar275);
          auVar110 = vpaddd_avx(auVar110,auVar275);
          auVar91._16_16_ = auVar73;
          auVar91._0_16_ = auVar110;
          auVar192 = vfmadd213ps_fma(auVar91,auVar205,auVar66);
          auVar137._8_4_ = 0x800000;
          auVar137._0_8_ = 0x80000000800000;
          auVar137._12_4_ = 0x800000;
          auVar137._16_4_ = 0x800000;
          auVar137._20_4_ = 0x800000;
          auVar137._24_4_ = 0x800000;
          auVar137._28_4_ = 0x800000;
          auVar64 = vmaxps_avx(ZEXT1632(auVar192),auVar137);
          auVar110 = vpsrld_avx(auVar64._0_16_,0x17);
          auVar73 = vpsrld_avx(auVar64._16_16_,0x17);
          auVar291._8_4_ = 0x807fffff;
          auVar291._0_8_ = 0x807fffff807fffff;
          auVar291._12_4_ = 0x807fffff;
          auVar291._16_4_ = 0x807fffff;
          auVar291._20_4_ = 0x807fffff;
          auVar291._24_4_ = 0x807fffff;
          auVar291._28_4_ = 0x807fffff;
          auVar64 = vandps_avx(auVar291,auVar64);
          auVar109 = vorps_avx(auVar361,auVar64);
          auVar292._8_4_ = 0x3f3504f3;
          auVar292._0_8_ = 0x3f3504f33f3504f3;
          auVar292._12_4_ = 0x3f3504f3;
          auVar292._16_4_ = 0x3f3504f3;
          auVar292._20_4_ = 0x3f3504f3;
          auVar292._24_4_ = 0x3f3504f3;
          auVar292._28_4_ = 0x3f3504f3;
          auVar61 = vcmpps_avx(auVar292,auVar109,2);
          auVar64 = vandnps_avx(auVar61,auVar109);
          auVar332._8_4_ = 0xbf800000;
          auVar332._0_8_ = 0xbf800000bf800000;
          auVar332._12_4_ = 0xbf800000;
          auVar332._16_4_ = 0xbf800000;
          auVar332._20_4_ = 0xbf800000;
          auVar332._24_4_ = 0xbf800000;
          auVar332._28_4_ = 0xbf800000;
          auVar138._0_4_ = auVar64._0_4_ + auVar109._0_4_ + -1.0;
          auVar138._4_4_ = auVar64._4_4_ + auVar109._4_4_ + -1.0;
          auVar138._8_4_ = auVar64._8_4_ + auVar109._8_4_ + -1.0;
          auVar138._12_4_ = auVar64._12_4_ + auVar109._12_4_ + -1.0;
          auVar138._16_4_ = auVar64._16_4_ + auVar109._16_4_ + -1.0;
          auVar138._20_4_ = auVar64._20_4_ + auVar109._20_4_ + -1.0;
          auVar138._24_4_ = auVar64._24_4_ + auVar109._24_4_ + -1.0;
          auVar138._28_4_ = auVar64._28_4_ + auVar109._28_4_ + -1.0;
          auVar73 = vpsubd_avx(auVar73,auVar61._16_16_);
          auVar297._8_4_ = 0xffffff81;
          auVar297._0_8_ = 0xffffff81ffffff81;
          auVar297._12_4_ = 0xffffff81;
          auVar73 = vpaddd_avx(auVar297,auVar73);
          auVar110 = vpsubd_avx(auVar110,auVar61._0_16_);
          auVar110 = vpaddd_avx(auVar297,auVar110);
          auVar206._16_16_ = auVar73;
          auVar206._0_16_ = auVar110;
          auVar256._0_4_ = auVar138._0_4_ * auVar138._0_4_;
          auVar256._4_4_ = auVar138._4_4_ * auVar138._4_4_;
          auVar256._8_4_ = auVar138._8_4_ * auVar138._8_4_;
          auVar256._12_4_ = auVar138._12_4_ * auVar138._12_4_;
          auVar256._16_4_ = auVar138._16_4_ * auVar138._16_4_;
          auVar256._20_4_ = auVar138._20_4_ * auVar138._20_4_;
          auVar256._24_4_ = auVar138._24_4_ * auVar138._24_4_;
          auVar256._28_4_ = 0;
          auVar293._8_4_ = 0x3d9021bb;
          auVar293._0_8_ = 0x3d9021bb3d9021bb;
          auVar293._12_4_ = 0x3d9021bb;
          auVar293._16_4_ = 0x3d9021bb;
          auVar293._20_4_ = 0x3d9021bb;
          auVar293._24_4_ = 0x3d9021bb;
          auVar293._28_4_ = 0x3d9021bb;
          auVar314._8_4_ = 0xbdebd1b8;
          auVar314._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar314._12_4_ = 0xbdebd1b8;
          auVar314._16_4_ = 0xbdebd1b8;
          auVar314._20_4_ = 0xbdebd1b8;
          auVar314._24_4_ = 0xbdebd1b8;
          auVar314._28_4_ = 0xbdebd1b8;
          auVar73 = vfmadd213ps_fma(auVar293,auVar138,auVar314);
          auVar315._8_4_ = 0x3def251a;
          auVar315._0_8_ = 0x3def251a3def251a;
          auVar315._12_4_ = 0x3def251a;
          auVar315._16_4_ = 0x3def251a;
          auVar315._20_4_ = 0x3def251a;
          auVar315._24_4_ = 0x3def251a;
          auVar315._28_4_ = 0x3def251a;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar138,auVar315);
          auVar316._8_4_ = 0xbdfe5d4f;
          auVar316._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar316._12_4_ = 0xbdfe5d4f;
          auVar316._16_4_ = 0xbdfe5d4f;
          auVar316._20_4_ = 0xbdfe5d4f;
          auVar316._24_4_ = 0xbdfe5d4f;
          auVar316._28_4_ = 0xbdfe5d4f;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar138,auVar316);
          auVar317._8_4_ = 0x3e11e9bf;
          auVar317._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar317._12_4_ = 0x3e11e9bf;
          auVar317._16_4_ = 0x3e11e9bf;
          auVar317._20_4_ = 0x3e11e9bf;
          auVar317._24_4_ = 0x3e11e9bf;
          auVar317._28_4_ = 0x3e11e9bf;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar138,auVar317);
          auVar318._8_4_ = 0xbe2aae50;
          auVar318._0_8_ = 0xbe2aae50be2aae50;
          auVar318._12_4_ = 0xbe2aae50;
          auVar318._16_4_ = 0xbe2aae50;
          auVar318._20_4_ = 0xbe2aae50;
          auVar318._24_4_ = 0xbe2aae50;
          auVar318._28_4_ = 0xbe2aae50;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar138,auVar318);
          auVar319._8_4_ = 0x3e4cceac;
          auVar319._0_8_ = 0x3e4cceac3e4cceac;
          auVar319._12_4_ = 0x3e4cceac;
          auVar319._16_4_ = 0x3e4cceac;
          auVar319._20_4_ = 0x3e4cceac;
          auVar319._24_4_ = 0x3e4cceac;
          auVar319._28_4_ = 0x3e4cceac;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar138,auVar319);
          auVar320._8_4_ = 0xbe7ffffc;
          auVar320._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar320._12_4_ = 0xbe7ffffc;
          auVar320._16_4_ = 0xbe7ffffc;
          auVar320._20_4_ = 0xbe7ffffc;
          auVar320._24_4_ = 0xbe7ffffc;
          auVar320._28_4_ = 0xbe7ffffc;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar138,auVar320);
          auVar321._8_4_ = 0x3eaaaaaa;
          auVar321._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar321._12_4_ = 0x3eaaaaaa;
          auVar321._16_4_ = 0x3eaaaaaa;
          auVar321._20_4_ = 0x3eaaaaaa;
          auVar321._24_4_ = 0x3eaaaaaa;
          auVar321._28_4_ = 0x3eaaaaaa;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar138,auVar321);
          auVar294._0_4_ = auVar256._0_4_ * auVar138._0_4_ * auVar73._0_4_;
          auVar294._4_4_ = auVar256._4_4_ * auVar138._4_4_ * auVar73._4_4_;
          auVar294._8_4_ = auVar256._8_4_ * auVar138._8_4_ * auVar73._8_4_;
          auVar294._12_4_ = auVar256._12_4_ * auVar138._12_4_ * auVar73._12_4_;
          auVar294._16_4_ = auVar256._16_4_ * auVar138._16_4_ * 0.0;
          auVar294._20_4_ = auVar256._20_4_ * auVar138._20_4_ * 0.0;
          auVar294._24_4_ = auVar256._24_4_ * auVar138._24_4_ * 0.0;
          auVar294._28_4_ = 0;
          auVar61 = vcvtdq2ps_avx(auVar206);
          auVar73 = vfmadd231ps_fma(auVar294,auVar61,auVar338);
          auVar73 = vfmsub231ps_fma(ZEXT1632(auVar73),auVar361,auVar256);
          auVar64 = vcmpps_avx(ZEXT1632(auVar192),_DAT_004dd0e0,2);
          auVar109 = vsubps_avx(ZEXT1632(auVar73),auVar138);
          auVar73 = vfmsub231ps_fma(auVar109,auVar353,auVar61);
          auVar322._8_4_ = 0xc0000000;
          auVar322._0_8_ = 0xc0000000c0000000;
          auVar322._12_4_ = 0xc0000000;
          auVar322._16_4_ = 0xc0000000;
          auVar322._20_4_ = 0xc0000000;
          auVar322._24_4_ = 0xc0000000;
          auVar322._28_4_ = 0xc0000000;
          auVar139._0_4_ = auVar73._0_4_ * -2.0;
          auVar139._4_4_ = auVar73._4_4_ * -2.0;
          auVar139._8_4_ = auVar73._8_4_ * -2.0;
          auVar139._12_4_ = auVar73._12_4_ * -2.0;
          auVar139._16_4_ = 0x80000000;
          auVar139._20_4_ = 0x80000000;
          auVar139._24_4_ = 0x80000000;
          auVar139._28_4_ = 0;
          auVar207._8_4_ = 0x7fffffff;
          auVar207._0_8_ = 0x7fffffff7fffffff;
          auVar207._12_4_ = 0x7fffffff;
          auVar207._16_4_ = 0x7fffffff;
          auVar207._20_4_ = 0x7fffffff;
          auVar207._24_4_ = 0x7fffffff;
          auVar207._28_4_ = 0x7fffffff;
          auVar64 = vblendvps_avx(auVar139,auVar207,auVar64);
          auVar140._8_4_ = 0x42b0c0a5;
          auVar140._0_8_ = 0x42b0c0a542b0c0a5;
          auVar140._12_4_ = 0x42b0c0a5;
          auVar140._16_4_ = 0x42b0c0a5;
          auVar140._20_4_ = 0x42b0c0a5;
          auVar140._24_4_ = 0x42b0c0a5;
          auVar140._28_4_ = 0x42b0c0a5;
          auVar64 = vminps_avx(auVar64,auVar140);
          auVar141._8_4_ = 0xc2b0c0a5;
          auVar141._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar141._12_4_ = 0xc2b0c0a5;
          auVar141._16_4_ = 0xc2b0c0a5;
          auVar141._20_4_ = 0xc2b0c0a5;
          auVar141._24_4_ = 0xc2b0c0a5;
          auVar141._28_4_ = 0xc2b0c0a5;
          auVar61 = vmaxps_avx(auVar64,auVar141);
          auVar142._8_4_ = 0x3fb8aa3b;
          auVar142._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar142._12_4_ = 0x3fb8aa3b;
          auVar142._16_4_ = 0x3fb8aa3b;
          auVar142._20_4_ = 0x3fb8aa3b;
          auVar142._24_4_ = 0x3fb8aa3b;
          auVar142._28_4_ = 0x3fb8aa3b;
          auVar73 = vfmadd213ps_fma(auVar142,auVar61,auVar361);
          auVar109 = vroundps_avx(ZEXT1632(auVar73),1);
          auVar64 = vcmpps_avx(ZEXT1632(auVar73),auVar109,1);
          auVar64 = vandps_avx(auVar64,auVar66);
          auVar64 = vsubps_avx(auVar109,auVar64);
          auVar73 = vfmsub231ps_fma(auVar61,auVar64,auVar353);
          auVar110 = vfnmsub231ps_fma(ZEXT1632(auVar73),auVar64,auVar338);
          auVar61 = ZEXT1632(auVar110);
          auVar20._28_4_ = auVar109._28_4_;
          auVar20._0_28_ =
               ZEXT1628(CONCAT412(auVar110._12_4_ * auVar110._12_4_,
                                  CONCAT48(auVar110._8_4_ * auVar110._8_4_,
                                           CONCAT44(auVar110._4_4_ * auVar110._4_4_,
                                                    auVar110._0_4_ * auVar110._0_4_))));
          auVar257._8_4_ = 0x39506967;
          auVar257._0_8_ = 0x3950696739506967;
          auVar257._12_4_ = 0x39506967;
          auVar257._16_4_ = 0x39506967;
          auVar257._20_4_ = 0x39506967;
          auVar257._24_4_ = 0x39506967;
          auVar257._28_4_ = 0x39506967;
          auVar363 = ZEXT864(0) << 0x20;
          auVar73 = vfmadd213ps_fma(auVar257,auVar61,auVar357);
          auVar339._8_4_ = 0x3c088908;
          auVar339._0_8_ = 0x3c0889083c088908;
          auVar339._12_4_ = 0x3c088908;
          auVar339._16_4_ = 0x3c088908;
          auVar339._20_4_ = 0x3c088908;
          auVar339._24_4_ = 0x3c088908;
          auVar339._28_4_ = 0x3c088908;
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar339);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar227);
          auVar237 = ZEXT3264(auVar66);
          auVar61 = ZEXT1632(auVar110);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar345);
          auVar73 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar61,auVar361);
          auVar192 = vfmadd213ps_fma(ZEXT1632(auVar73),auVar20,auVar61);
          auVar74._0_4_ = (int)auVar64._0_4_;
          auVar74._4_4_ = (int)auVar64._4_4_;
          auVar74._8_4_ = (int)auVar64._8_4_;
          auVar74._12_4_ = (int)auVar64._12_4_;
          auVar92._16_4_ = (int)auVar64._16_4_;
          auVar92._0_16_ = auVar74;
          auVar92._20_4_ = (int)auVar64._20_4_;
          auVar92._24_4_ = (int)auVar64._24_4_;
          auVar92._28_4_ = (int)auVar64._28_4_;
          auVar110 = vpslld_avx(auVar74,0x17);
          auVar73 = vpslld_avx(auVar92._16_16_,0x17);
          auVar73 = vpaddd_avx(auVar73,auVar275);
          auVar110 = vpaddd_avx(auVar110,auVar275);
          auVar93._16_16_ = auVar73;
          auVar93._0_16_ = auVar110;
          auVar143._0_4_ = auVar192._0_4_ + fVar3;
          auVar143._4_4_ = auVar192._4_4_ + fVar4;
          auVar143._8_4_ = auVar192._8_4_ + fVar159;
          auVar143._12_4_ = auVar192._12_4_ + fVar14;
          auVar143._16_4_ = fVar15 + 0.0;
          auVar143._20_4_ = fVar16 + 0.0;
          auVar143._24_4_ = fVar17 + 0.0;
          auVar143._28_4_ = fVar18 + 0.0;
          auVar73 = vfmadd213ps_fma(auVar93,auVar143,auVar66);
          auVar64 = vrcpps_avx(ZEXT1632(auVar73));
          auVar73 = vfmsub213ps_fma(ZEXT1632(auVar73),auVar64,auVar66);
          auVar73 = vfnmadd132ps_fma(ZEXT1632(auVar73),auVar64,auVar64);
          auVar73 = vfnmadd213ps_fma(ZEXT1632(auVar73),auVar322,auVar332);
          auVar69 = ZEXT1664(auVar73);
          goto LAB_002f5402;
        case 6:
          uVar2 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar99._4_4_ = uVar2;
          auVar99._0_4_ = uVar2;
          auVar99._8_4_ = uVar2;
          auVar99._12_4_ = uVar2;
          auVar99._16_4_ = uVar2;
          auVar99._20_4_ = uVar2;
          auVar99._24_4_ = uVar2;
          auVar99._28_4_ = uVar2;
          uVar2 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar147._4_4_ = uVar2;
          auVar147._0_4_ = uVar2;
          auVar147._8_4_ = uVar2;
          auVar147._12_4_ = uVar2;
          auVar147._16_4_ = uVar2;
          auVar147._20_4_ = uVar2;
          auVar147._24_4_ = uVar2;
          auVar147._28_4_ = uVar2;
          auVar73 = vfmadd231ps_fma(auVar147,auVar59,auVar99);
          auVar64 = vmaxps_avx(auVar61,ZEXT1632(auVar73));
          auVar64 = vminps_avx(auVar64,auVar66);
          auVar69 = ZEXT3264(auVar64);
LAB_002f5402:
          auVar274._0_4_ = auVar69._0_4_ * fVar49;
          auVar274._4_4_ = auVar69._4_4_ * fVar70;
          auVar274._8_4_ = auVar69._8_4_ * auVar59._8_4_;
          auVar274._12_4_ = auVar69._12_4_ * auVar59._12_4_;
          auVar274._16_4_ = auVar69._16_4_ * auVar59._16_4_;
          auVar274._20_4_ = auVar69._20_4_ * auVar59._20_4_;
          auVar274._28_36_ = auVar69._28_36_;
          auVar274._24_4_ = auVar69._24_4_ * auVar59._24_4_;
          auVar64 = auVar274._0_32_;
        }
switchD_002f4fb9_caseD_1:
        *(undefined1 (*) [32])((long)top_blob->data + uVar38 * 0x20) = auVar64;
      }
    }
    iVar27 = 0;
  }
  if (piStack_380 != (int *)0x0) {
    LOCK();
    *piStack_380 = *piStack_380 + -1;
    UNLOCK();
    if (*piStack_380 == 0) {
      if (local_368 == (Allocator *)0x0) {
        free(local_388);
      }
      else {
        (*local_368->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int InnerProduct_x86_fma::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}